

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.t.cpp
# Opt level: O0

void relop<int,int,int>(env *lest_env)

{
  ostream *poVar1;
  bool bVar2;
  __optional_eq_t<int,_int> _Var3;
  __optional_lt_t<int,_int> _Var4;
  __optional_le_t<int,_int> _Var5;
  __optional_gt_t<int,_int> _Var6;
  __optional_ge_t<int,_int> _Var7;
  failure *pfVar8;
  text local_7bc8;
  text local_7ba8;
  allocator<char> local_7b81;
  text local_7b80;
  allocator<char> local_7b59;
  text local_7b58;
  location local_7b38;
  message local_7b10;
  undefined1 local_7a91;
  text local_7a90;
  allocator<char> local_7a69;
  text local_7a68;
  allocator<char> local_7a41;
  text local_7a40;
  location local_7a20;
  int local_79f8;
  expression_decomposer local_79f1;
  int *local_79f0;
  undefined1 local_79e8 [8];
  result score_43;
  text local_79b8;
  undefined1 local_7998 [8];
  ctx lest__ctx_section_43;
  int lest__count_44;
  int lest__section_44;
  text local_78f8;
  text local_78d8;
  allocator<char> local_78b1;
  text local_78b0;
  allocator<char> local_7889;
  text local_7888;
  location local_7868;
  message local_7840;
  undefined1 local_77c1;
  text local_77c0;
  allocator<char> local_7799;
  text local_7798;
  allocator<char> local_7771;
  text local_7770;
  location local_7750;
  int local_7728;
  expression_decomposer local_7721;
  optional<int> *local_7720;
  undefined1 local_7718 [8];
  result score_42;
  text local_76e8;
  undefined1 local_76c8 [8];
  ctx lest__ctx_section_42;
  int lest__count_43;
  int lest__section_43;
  text local_7628;
  text local_7608;
  allocator<char> local_75e1;
  text local_75e0;
  allocator<char> local_75b9;
  text local_75b8;
  location local_7598;
  message local_7570;
  undefined1 local_74f1;
  text local_74f0;
  allocator<char> local_74c9;
  text local_74c8;
  allocator<char> local_74a1;
  text local_74a0;
  location local_7480;
  int local_7458;
  expression_decomposer local_7451;
  int *local_7450;
  undefined1 local_7448 [8];
  result score_41;
  text local_7418;
  undefined1 local_73f8 [8];
  ctx lest__ctx_section_41;
  int lest__count_42;
  int lest__section_42;
  text local_7358;
  text local_7338;
  allocator<char> local_7311;
  text local_7310;
  allocator<char> local_72e9;
  text local_72e8;
  location local_72c8;
  message local_72a0;
  undefined1 local_7221;
  text local_7220;
  allocator<char> local_71f9;
  text local_71f8;
  allocator<char> local_71d1;
  text local_71d0;
  location local_71b0;
  int local_7188;
  expression_decomposer local_7181;
  optional<int> *local_7180;
  undefined1 local_7178 [8];
  result score_40;
  text local_7148;
  undefined1 local_7128 [8];
  ctx lest__ctx_section_40;
  int lest__count_41;
  int lest__section_41;
  text local_7088;
  text local_7068;
  allocator<char> local_7041;
  text local_7040;
  allocator<char> local_7019;
  text local_7018;
  location local_6ff8;
  message local_6fd0;
  undefined1 local_6f51;
  text local_6f50;
  allocator<char> local_6f29;
  text local_6f28;
  allocator<char> local_6f01;
  text local_6f00;
  location local_6ee0;
  int local_6eb8;
  expression_decomposer local_6eb1;
  int *local_6eb0;
  undefined1 local_6ea8 [8];
  result score_39;
  text local_6e78;
  undefined1 local_6e58 [8];
  ctx lest__ctx_section_39;
  int lest__count_40;
  int lest__section_40;
  text local_6db8;
  text local_6d98;
  allocator<char> local_6d71;
  text local_6d70;
  allocator<char> local_6d49;
  text local_6d48;
  location local_6d28;
  message local_6d00;
  undefined1 local_6c81;
  text local_6c80;
  allocator<char> local_6c59;
  text local_6c58;
  allocator<char> local_6c31;
  text local_6c30;
  location local_6c10;
  int local_6be8;
  expression_decomposer local_6be1;
  optional<int> *local_6be0;
  undefined1 local_6bd8 [8];
  result score_38;
  text local_6ba8;
  undefined1 local_6b88 [8];
  ctx lest__ctx_section_38;
  int lest__count_39;
  int lest__section_39;
  text local_6ae8;
  text local_6ac8;
  allocator<char> local_6aa1;
  text local_6aa0;
  allocator<char> local_6a79;
  text local_6a78;
  location local_6a58;
  message local_6a30;
  undefined1 local_69b1;
  text local_69b0;
  allocator<char> local_6989;
  text local_6988;
  allocator<char> local_6961;
  text local_6960;
  location local_6940;
  int local_6918;
  expression_decomposer local_6911;
  int *local_6910;
  undefined1 local_6908 [8];
  result score_37;
  text local_68d8;
  undefined1 local_68b8 [8];
  ctx lest__ctx_section_37;
  int lest__count_38;
  int lest__section_38;
  text local_6818;
  text local_67f8;
  allocator<char> local_67d1;
  text local_67d0;
  allocator<char> local_67a9;
  text local_67a8;
  location local_6788;
  message local_6760;
  undefined1 local_66e1;
  text local_66e0;
  allocator<char> local_66b9;
  text local_66b8;
  allocator<char> local_6691;
  text local_6690;
  location local_6670;
  int local_6648;
  expression_decomposer local_6641;
  optional<int> *local_6640;
  undefined1 local_6638 [8];
  result score_36;
  text local_6608;
  undefined1 local_65e8 [8];
  ctx lest__ctx_section_36;
  int lest__count_37;
  int lest__section_37;
  text local_6548;
  text local_6528;
  allocator<char> local_6501;
  text local_6500;
  allocator<char> local_64d9;
  text local_64d8;
  location local_64b8;
  message local_6490;
  undefined1 local_6411;
  text local_6410;
  allocator<char> local_63e9;
  text local_63e8;
  allocator<char> local_63c1;
  text local_63c0;
  location local_63a0;
  int local_6378;
  expression_decomposer local_6371;
  int *local_6370;
  undefined1 local_6368 [8];
  result score_35;
  text local_6338;
  undefined1 local_6318 [8];
  ctx lest__ctx_section_35;
  int lest__count_36;
  int lest__section_36;
  text local_6278;
  text local_6258;
  allocator<char> local_6231;
  text local_6230;
  allocator<char> local_6209;
  text local_6208;
  location local_61e8;
  message local_61c0;
  undefined1 local_6141;
  text local_6140;
  allocator<char> local_6119;
  text local_6118;
  allocator<char> local_60f1;
  text local_60f0;
  location local_60d0;
  int local_60a8;
  expression_decomposer local_60a1;
  optional<int> *local_60a0;
  undefined1 local_6098 [8];
  result score_34;
  text local_6068;
  undefined1 local_6048 [8];
  ctx lest__ctx_section_34;
  int lest__count_35;
  int lest__section_35;
  text local_5fa8;
  text local_5f88;
  allocator<char> local_5f61;
  text local_5f60;
  allocator<char> local_5f39;
  text local_5f38;
  location local_5f18;
  message local_5ef0;
  undefined1 local_5e71;
  text local_5e70;
  allocator<char> local_5e49;
  text local_5e48;
  allocator<char> local_5e21;
  text local_5e20;
  location local_5e00;
  int local_5dd8;
  expression_decomposer local_5dd1;
  int *local_5dd0;
  undefined1 local_5dc8 [8];
  result score_33;
  text local_5d98;
  undefined1 local_5d78 [8];
  ctx lest__ctx_section_33;
  int lest__count_34;
  int lest__section_34;
  text local_5cd8;
  text local_5cb8;
  allocator<char> local_5c91;
  text local_5c90;
  allocator<char> local_5c69;
  text local_5c68;
  location local_5c48;
  message local_5c20;
  undefined1 local_5ba1;
  text local_5ba0;
  allocator<char> local_5b79;
  text local_5b78;
  allocator<char> local_5b51;
  text local_5b50;
  location local_5b30;
  int local_5b08;
  expression_decomposer local_5b01;
  optional<int> *local_5b00;
  undefined1 local_5af8 [8];
  result score_32;
  text local_5ac8;
  undefined1 local_5aa8 [8];
  ctx lest__ctx_section_32;
  int lest__count_33;
  int lest__section_33;
  text local_5a08;
  text local_59e8;
  allocator<char> local_59c1;
  text local_59c0;
  allocator<char> local_5999;
  text local_5998;
  location local_5978;
  message local_5950;
  undefined1 local_58d1;
  text local_58d0;
  allocator<char> local_58a9;
  text local_58a8;
  allocator<char> local_5881;
  text local_5880;
  location local_5860;
  bool local_5832;
  expression_decomposer local_5831;
  bool *local_5830;
  undefined1 local_5828 [8];
  result score_31;
  text local_57f8;
  undefined1 local_57d8 [8];
  ctx lest__ctx_section_31;
  int lest__count_32;
  int lest__section_32;
  text local_5738;
  text local_5718;
  allocator<char> local_56f1;
  text local_56f0;
  allocator<char> local_56c9;
  text local_56c8;
  location local_56a8;
  message local_5680;
  undefined1 local_5601;
  text local_5600;
  allocator<char> local_55d9;
  text local_55d8;
  allocator<char> local_55b1;
  text local_55b0;
  location local_5590;
  bool local_5562;
  expression_decomposer local_5561;
  bool *local_5560;
  undefined1 local_5558 [8];
  result score_30;
  text local_5528;
  undefined1 local_5508 [8];
  ctx lest__ctx_section_30;
  int lest__count_31;
  int lest__section_31;
  text local_5468;
  text local_5448;
  allocator<char> local_5421;
  text local_5420;
  allocator<char> local_53f9;
  text local_53f8;
  location local_53d8;
  message local_53b0;
  undefined1 local_5331;
  text local_5330;
  allocator<char> local_5309;
  text local_5308;
  allocator<char> local_52e1;
  text local_52e0;
  location local_52c0;
  bool local_5292;
  expression_decomposer local_5291;
  bool *local_5290;
  undefined1 local_5288 [8];
  result score_29;
  text local_5258;
  undefined1 local_5238 [8];
  ctx lest__ctx_section_29;
  int lest__count_30;
  int lest__section_30;
  text local_5198;
  text local_5178;
  allocator<char> local_5151;
  text local_5150;
  allocator<char> local_5129;
  text local_5128;
  location local_5108;
  message local_50e0;
  undefined1 local_5061;
  text local_5060;
  allocator<char> local_5039;
  text local_5038;
  allocator<char> local_5011;
  text local_5010;
  location local_4ff0;
  bool local_4fc2;
  expression_decomposer local_4fc1;
  bool *local_4fc0;
  undefined1 local_4fb8 [8];
  result score_28;
  text local_4f88;
  undefined1 local_4f68 [8];
  ctx lest__ctx_section_28;
  int lest__count_29;
  int lest__section_29;
  text local_4ec8;
  text local_4ea8;
  allocator<char> local_4e81;
  text local_4e80;
  allocator<char> local_4e59;
  text local_4e58;
  location local_4e38;
  message local_4e10;
  undefined1 local_4d91;
  text local_4d90;
  allocator<char> local_4d69;
  text local_4d68;
  allocator<char> local_4d41;
  text local_4d40;
  location local_4d20;
  bool local_4cf2;
  expression_decomposer local_4cf1;
  bool *local_4cf0;
  undefined1 local_4ce8 [8];
  result score_27;
  text local_4cb8;
  undefined1 local_4c98 [8];
  ctx lest__ctx_section_27;
  int lest__count_28;
  int lest__section_28;
  text local_4bf8;
  text local_4bd8;
  allocator<char> local_4bb1;
  text local_4bb0;
  allocator<char> local_4b89;
  text local_4b88;
  location local_4b68;
  message local_4b40;
  undefined1 local_4ac1;
  text local_4ac0;
  allocator<char> local_4a99;
  text local_4a98;
  allocator<char> local_4a71;
  text local_4a70;
  location local_4a50;
  bool local_4a22;
  expression_decomposer local_4a21;
  bool *local_4a20;
  undefined1 local_4a18 [8];
  result score_26;
  text local_49e8;
  undefined1 local_49c8 [8];
  ctx lest__ctx_section_26;
  int lest__count_27;
  int lest__section_27;
  text local_4928;
  text local_4908;
  allocator<char> local_48e1;
  text local_48e0;
  allocator<char> local_48b9;
  text local_48b8;
  location local_4898;
  message local_4870;
  undefined1 local_47f1;
  text local_47f0;
  allocator<char> local_47c9;
  text local_47c8;
  allocator<char> local_47a1;
  text local_47a0;
  location local_4780;
  bool local_4752;
  expression_decomposer local_4751;
  bool *local_4750;
  undefined1 local_4748 [8];
  result score_25;
  text local_4718;
  undefined1 local_46f8 [8];
  ctx lest__ctx_section_25;
  int lest__count_26;
  int lest__section_26;
  text local_4658;
  text local_4638;
  allocator<char> local_4611;
  text local_4610;
  allocator<char> local_45e9;
  text local_45e8;
  location local_45c8;
  message local_45a0;
  undefined1 local_4521;
  text local_4520;
  allocator<char> local_44f9;
  text local_44f8;
  allocator<char> local_44d1;
  text local_44d0;
  location local_44b0;
  bool local_4482;
  expression_decomposer local_4481;
  bool *local_4480;
  undefined1 local_4478 [8];
  result score_24;
  text local_4448;
  undefined1 local_4428 [8];
  ctx lest__ctx_section_24;
  int lest__count_25;
  int lest__section_25;
  text local_4388;
  text local_4368;
  allocator<char> local_4341;
  text local_4340;
  allocator<char> local_4319;
  text local_4318;
  location local_42f8;
  message local_42d0;
  undefined1 local_4251;
  text local_4250;
  allocator<char> local_4229;
  text local_4228;
  allocator<char> local_4201;
  text local_4200;
  location local_41e0;
  bool local_41b2;
  expression_decomposer local_41b1;
  bool *local_41b0;
  undefined1 local_41a8 [8];
  result score_23;
  text local_4178;
  undefined1 local_4158 [8];
  ctx lest__ctx_section_23;
  int lest__count_24;
  int lest__section_24;
  text local_40b8;
  text local_4098;
  allocator<char> local_4071;
  text local_4070;
  allocator<char> local_4049;
  text local_4048;
  location local_4028;
  message local_4000;
  undefined1 local_3f81;
  text local_3f80;
  allocator<char> local_3f59;
  text local_3f58;
  allocator<char> local_3f31;
  text local_3f30;
  location local_3f10;
  bool local_3ee2;
  expression_decomposer local_3ee1;
  bool *local_3ee0;
  undefined1 local_3ed8 [8];
  result score_22;
  text local_3ea8;
  undefined1 local_3e88 [8];
  ctx lest__ctx_section_22;
  int lest__count_23;
  int lest__section_23;
  text local_3de8;
  text local_3dc8;
  allocator<char> local_3da1;
  text local_3da0;
  allocator<char> local_3d79;
  text local_3d78;
  location local_3d58;
  message local_3d30;
  undefined1 local_3cb1;
  text local_3cb0;
  allocator<char> local_3c89;
  text local_3c88;
  allocator<char> local_3c61;
  text local_3c60;
  location local_3c40;
  bool local_3c12;
  expression_decomposer local_3c11;
  bool *local_3c10;
  undefined1 local_3c08 [8];
  result score_21;
  text local_3bd8;
  undefined1 local_3bb8 [8];
  ctx lest__ctx_section_21;
  int lest__count_22;
  int lest__section_22;
  text local_3b18;
  text local_3af8;
  allocator<char> local_3ad1;
  text local_3ad0;
  allocator<char> local_3aa9;
  text local_3aa8;
  location local_3a88;
  message local_3a60;
  undefined1 local_39e1;
  text local_39e0;
  allocator<char> local_39b9;
  text local_39b8;
  allocator<char> local_3991;
  text local_3990;
  location local_3970;
  bool local_3942;
  expression_decomposer local_3941;
  bool *local_3940;
  undefined1 local_3938 [8];
  result score_20;
  text local_3908;
  undefined1 local_38e8 [8];
  ctx lest__ctx_section_20;
  int lest__count_21;
  int lest__section_21;
  text local_3848;
  text local_3828;
  allocator<char> local_3801;
  text local_3800;
  allocator<char> local_37d9;
  text local_37d8;
  location local_37b8;
  message local_3790;
  undefined1 local_3711;
  text local_3710;
  allocator<char> local_36e9;
  text local_36e8;
  allocator<char> local_36c1;
  text local_36c0;
  location local_36a0;
  bool local_3672;
  expression_decomposer local_3671;
  bool *local_3670;
  undefined1 local_3668 [8];
  result score_19;
  text local_3638;
  undefined1 local_3618 [8];
  ctx lest__ctx_section_19;
  int lest__count_20;
  int lest__section_20;
  text local_3578;
  text local_3558;
  allocator<char> local_3531;
  text local_3530;
  allocator<char> local_3509;
  text local_3508;
  location local_34e8;
  message local_34c0;
  undefined1 local_3441;
  text local_3440;
  allocator<char> local_3419;
  text local_3418;
  allocator<char> local_33f1;
  text local_33f0;
  location local_33d0;
  expression_decomposer local_33a1;
  optional<int> *local_33a0;
  undefined1 local_3398 [8];
  result score_18;
  text local_3368;
  undefined1 local_3348 [8];
  ctx lest__ctx_section_18;
  int lest__count_19;
  int lest__section_19;
  text local_32a8;
  text local_3288;
  allocator<char> local_3261;
  text local_3260;
  allocator<char> local_3239;
  text local_3238;
  location local_3218;
  message local_31f0;
  undefined1 local_3171;
  text local_3170;
  allocator<char> local_3149;
  text local_3148;
  allocator<char> local_3121;
  text local_3120;
  location local_3100;
  expression_decomposer local_30d1;
  optional<int> *local_30d0;
  undefined1 local_30c8 [8];
  result score_17;
  text local_3098;
  undefined1 local_3078 [8];
  ctx lest__ctx_section_17;
  int lest__count_18;
  int lest__section_18;
  text local_2fd8;
  text local_2fb8;
  allocator<char> local_2f91;
  text local_2f90;
  allocator<char> local_2f69;
  text local_2f68;
  location local_2f48;
  message local_2f20;
  undefined1 local_2ea1;
  text local_2ea0;
  allocator<char> local_2e79;
  text local_2e78;
  allocator<char> local_2e51;
  text local_2e50;
  location local_2e30;
  expression_decomposer local_2e01;
  optional<int> *local_2e00;
  undefined1 local_2df8 [8];
  result score_16;
  text local_2dc8;
  undefined1 local_2da8 [8];
  ctx lest__ctx_section_16;
  int lest__count_17;
  int lest__section_17;
  text local_2d08;
  text local_2ce8;
  allocator<char> local_2cc1;
  text local_2cc0;
  allocator<char> local_2c99;
  text local_2c98;
  location local_2c78;
  message local_2c50;
  undefined1 local_2bd1;
  text local_2bd0;
  allocator<char> local_2ba9;
  text local_2ba8;
  allocator<char> local_2b81;
  text local_2b80;
  location local_2b60;
  bool local_2b32;
  expression_decomposer local_2b31;
  bool *local_2b30;
  undefined1 local_2b28 [8];
  result score_15;
  text local_2af8;
  undefined1 local_2ad8 [8];
  ctx lest__ctx_section_15;
  int lest__count_16;
  int lest__section_16;
  text local_2a38;
  text local_2a18;
  allocator<char> local_29f1;
  text local_29f0;
  allocator<char> local_29c9;
  text local_29c8;
  location local_29a8;
  message local_2980;
  undefined1 local_2901;
  text local_2900;
  allocator<char> local_28d9;
  text local_28d8;
  allocator<char> local_28b1;
  text local_28b0;
  location local_2890;
  expression_decomposer local_2861;
  optional<int> *local_2860;
  undefined1 local_2858 [8];
  result score_14;
  text local_2828;
  undefined1 local_2808 [8];
  ctx lest__ctx_section_14;
  int lest__count_15;
  int lest__section_15;
  text local_2768;
  text local_2748;
  allocator<char> local_2721;
  text local_2720;
  allocator<char> local_26f9;
  text local_26f8;
  location local_26d8;
  message local_26b0;
  undefined1 local_2631;
  text local_2630;
  allocator<char> local_2609;
  text local_2608;
  allocator<char> local_25e1;
  text local_25e0;
  location local_25c0;
  expression_decomposer local_2591;
  optional<int> *local_2590;
  undefined1 local_2588 [8];
  result score_13;
  text local_2558;
  undefined1 local_2538 [8];
  ctx lest__ctx_section_13;
  int lest__count_14;
  int lest__section_14;
  text local_2498;
  text local_2478;
  allocator<char> local_2451;
  text local_2450;
  allocator<char> local_2429;
  text local_2428;
  location local_2408;
  message local_23e0;
  undefined1 local_2361;
  text local_2360;
  allocator<char> local_2339;
  text local_2338;
  allocator<char> local_2311;
  text local_2310;
  location local_22f0;
  expression_decomposer local_22c1;
  optional<int> *local_22c0;
  undefined1 local_22b8 [8];
  result score_12;
  text local_2288;
  undefined1 local_2268 [8];
  ctx lest__ctx_section_12;
  int lest__count_13;
  int lest__section_13;
  text local_21c8;
  text local_21a8;
  allocator<char> local_2181;
  text local_2180;
  allocator<char> local_2159;
  text local_2158;
  location local_2138;
  message local_2110;
  undefined1 local_2091;
  text local_2090;
  allocator<char> local_2069;
  text local_2068;
  allocator<char> local_2041;
  text local_2040;
  location local_2020;
  bool local_1ff2;
  expression_decomposer local_1ff1;
  bool *local_1ff0;
  undefined1 local_1fe8 [8];
  result score_11;
  text local_1fb8;
  undefined1 local_1f98 [8];
  ctx lest__ctx_section_11;
  int lest__count_12;
  int lest__section_12;
  text local_1ef8;
  text local_1ed8;
  allocator<char> local_1eb1;
  text local_1eb0;
  allocator<char> local_1e89;
  text local_1e88;
  location local_1e68;
  message local_1e40;
  undefined1 local_1dc1;
  text local_1dc0;
  allocator<char> local_1d99;
  text local_1d98;
  allocator<char> local_1d71;
  text local_1d70;
  location local_1d50;
  expression_decomposer local_1d21;
  optional<int> *local_1d20;
  undefined1 local_1d18 [8];
  result score_10;
  text local_1ce8;
  undefined1 local_1cc8 [8];
  ctx lest__ctx_section_10;
  int lest__count_11;
  int lest__section_11;
  text local_1c28;
  text local_1c08;
  allocator<char> local_1be1;
  text local_1be0;
  allocator<char> local_1bb9;
  text local_1bb8;
  location local_1b98;
  message local_1b70;
  undefined1 local_1af1;
  text local_1af0;
  allocator<char> local_1ac9;
  text local_1ac8;
  allocator<char> local_1aa1;
  text local_1aa0;
  location local_1a80;
  expression_decomposer local_1a51;
  optional<int> *local_1a50;
  undefined1 local_1a48 [8];
  result score_9;
  text local_1a18;
  undefined1 local_19f8 [8];
  ctx lest__ctx_section_9;
  int lest__count_10;
  int lest__section_10;
  text local_1958;
  text local_1938;
  allocator<char> local_1911;
  text local_1910;
  allocator<char> local_18e9;
  text local_18e8;
  location local_18c8;
  message local_18a0;
  undefined1 local_1821;
  text local_1820;
  allocator<char> local_17f9;
  text local_17f8;
  allocator<char> local_17d1;
  text local_17d0;
  location local_17b0;
  expression_decomposer local_1781;
  optional<int> *local_1780;
  undefined1 local_1778 [8];
  result score_8;
  text local_1748;
  undefined1 local_1728 [8];
  ctx lest__ctx_section_8;
  int lest__count_9;
  int lest__section_9;
  text local_1688;
  text local_1668;
  allocator<char> local_1641;
  text local_1640;
  allocator<char> local_1619;
  text local_1618;
  location local_15f8;
  message local_15d0;
  undefined1 local_1551;
  text local_1550;
  allocator<char> local_1529;
  text local_1528;
  allocator<char> local_1501;
  text local_1500;
  location local_14e0;
  bool local_14b2;
  expression_decomposer local_14b1;
  bool *local_14b0;
  undefined1 local_14a8 [8];
  result score_7;
  text local_1478;
  undefined1 local_1458 [8];
  ctx lest__ctx_section_7;
  int lest__count_8;
  int lest__section_8;
  text local_13b8;
  text local_1398;
  allocator<char> local_1371;
  text local_1370;
  allocator<char> local_1349;
  text local_1348;
  location local_1328;
  message local_1300;
  undefined1 local_1281;
  text local_1280;
  allocator<char> local_1259;
  text local_1258;
  allocator<char> local_1231;
  text local_1230;
  location local_1210;
  expression_decomposer local_11e1;
  optional<int> *local_11e0;
  undefined1 local_11d8 [8];
  result score_6;
  text local_11a8;
  undefined1 local_1188 [8];
  ctx lest__ctx_section_6;
  int lest__count_7;
  int lest__section_7;
  text local_10e8;
  text local_10c8;
  allocator<char> local_10a1;
  text local_10a0;
  allocator<char> local_1079;
  text local_1078;
  location local_1058;
  message local_1030;
  undefined1 local_fb1;
  text local_fb0;
  allocator<char> local_f89;
  text local_f88;
  allocator<char> local_f61;
  text local_f60;
  location local_f40;
  expression_decomposer local_f11;
  optional<int> *local_f10;
  undefined1 local_f08 [8];
  result score_5;
  text local_ed8;
  undefined1 local_eb8 [8];
  ctx lest__ctx_section_5;
  int lest__count_6;
  int lest__section_6;
  text local_e18;
  text local_df8;
  allocator<char> local_dd1;
  text local_dd0;
  allocator<char> local_da9;
  text local_da8;
  location local_d88;
  message local_d60;
  undefined1 local_ce1;
  text local_ce0;
  allocator<char> local_cb9;
  text local_cb8;
  allocator<char> local_c91;
  text local_c90;
  location local_c70;
  expression_decomposer local_c41;
  optional<int> *local_c40;
  undefined1 local_c38 [8];
  result score_4;
  text local_c08;
  undefined1 local_be8 [8];
  ctx lest__ctx_section_4;
  int lest__count_5;
  int lest__section_5;
  text local_b48;
  text local_b28;
  allocator<char> local_b01;
  text local_b00;
  allocator<char> local_ad9;
  text local_ad8;
  location local_ab8;
  message local_a90;
  undefined1 local_a11;
  text local_a10;
  allocator<char> local_9e9;
  text local_9e8;
  allocator<char> local_9c1;
  text local_9c0;
  location local_9a0;
  expression_decomposer local_971;
  optional<int> *local_970;
  undefined1 local_968 [8];
  result score_3;
  text local_938;
  undefined1 local_918 [8];
  ctx lest__ctx_section_3;
  int lest__count_4;
  int lest__section_4;
  text local_878;
  text local_858;
  allocator<char> local_831;
  text local_830;
  allocator<char> local_809;
  text local_808;
  location local_7e8;
  message local_7c0;
  undefined1 local_741;
  text local_740;
  allocator<char> local_719;
  text local_718;
  allocator<char> local_6f1;
  text local_6f0;
  location local_6d0;
  bool local_6a2;
  expression_decomposer local_6a1;
  bool *local_6a0;
  undefined1 local_698 [8];
  result score_2;
  text local_668;
  undefined1 local_648 [8];
  ctx lest__ctx_section_2;
  int lest__count_3;
  int lest__section_3;
  text local_5a8;
  text local_588;
  allocator<char> local_561;
  text local_560;
  allocator<char> local_539;
  text local_538;
  location local_518;
  message local_4f0;
  undefined1 local_471;
  text local_470;
  allocator<char> local_449;
  text local_448;
  allocator<char> local_421;
  text local_420;
  location local_400;
  bool local_3d2;
  expression_decomposer local_3d1;
  bool *local_3d0;
  undefined1 local_3c8 [8];
  result score_1;
  text local_398;
  undefined1 local_378 [8];
  ctx lest__ctx_section_1;
  int lest__count_2;
  int lest__section_2;
  text local_2d8;
  text local_2b8;
  allocator<char> local_291;
  text local_290;
  allocator<char> local_269;
  text local_268;
  location local_248;
  message local_220;
  undefined1 local_1a1;
  text local_1a0;
  allocator<char> local_179;
  text local_178;
  allocator<char> local_151;
  text local_150;
  location local_130;
  expression_decomposer local_101;
  optional<int> *local_100;
  undefined1 local_f8 [8];
  result score;
  text local_c8;
  undefined1 local_a8 [8];
  ctx lest__ctx_section;
  int lest__count_1;
  int lest__section_1;
  int local_80;
  optional<int> local_7c;
  optional<int> e2;
  optional<int> e1;
  optional<int> d;
  allocator<char> local_49;
  text local_48;
  undefined1 local_28 [8];
  ctx lest__ctx_setup;
  int lest__count;
  int lest__section;
  env *lest_env_local;
  
  lest__ctx_setup._12_4_ = 0;
  lest__ctx_setup.once = true;
  lest__ctx_setup._9_3_ = 0;
  do {
    if ((int)lest__ctx_setup._8_4_ <= (int)lest__ctx_setup._12_4_) {
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
    lest::ctx::ctx((ctx *)local_28,lest_env,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_28), bVar2) {
      std::optional<int>::optional(&e1);
      e2.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_payload._M_value = 6;
      std::optional<int>::optional<int,_true>
                ((optional<int> *)
                 &e2.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged,(int *)&e2);
      local_80 = 7;
      std::optional<int>::optional<int,_true>(&local_7c,&local_80);
      lest::guard::guard((guard *)&lest__count_1,&relop<int,_int,_int>::id1330,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_1);
      if (bVar2) {
        lest__ctx_section.once = true;
        lest__ctx_section._9_3_ = 0;
        for (lest__ctx_section._12_4_ = 0;
            (int)lest__ctx_section._12_4_ < (int)lest__ctx_section._8_4_;
            lest__ctx_section._12_4_ = lest__ctx_section._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"engaged    == engaged",
                     (allocator<char> *)(score.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_a8,lest_env,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_a8), bVar2) {
            do {
              local_100 = (optional<int> *)
                          lest::expression_decomposer::operator<<
                                    (&local_101,
                                     (optional<int> *)
                                     &e2.super__Optional_base<int,_true,_true>._M_payload.
                                      super__Optional_payload_base<int>._M_engaged);
              lest::expression_lhs<std::optional<int>const&>::operator==
                        ((result *)local_f8,(expression_lhs<std::optional<int>const&> *)&local_100,
                         (optional<int> *)
                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_f8);
              if (bVar2) {
                local_1a1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_150,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_151);
                lest::location::location(&local_130,&local_150,0x532);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_178,"e1 == e1",&local_179);
                std::__cxx11::string::string((string *)&local_1a0,(string *)&score);
                lest::failure::failure(pfVar8,&local_130,&local_178,&local_1a0);
                local_1a1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_268,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_269);
                lest::location::location(&local_248,&local_268,0x532);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_290,"e1 == e1",&local_291);
                std::__cxx11::string::string((string *)&local_2b8,(string *)&score);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_220,&local_248,&local_290,&local_2b8,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_2d8,lest_env);
                lest::report(poVar1,&local_220,&local_2d8);
                std::__cxx11::string::~string((string *)&local_2d8);
                lest::passing::~passing((passing *)&local_220);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_290);
                std::allocator<char>::~allocator(&local_291);
                lest::location::~location(&local_248);
                std::__cxx11::string::~string((string *)&local_268);
                std::allocator<char>::~allocator(&local_269);
              }
              lest::result::~result((result *)local_f8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_a8);
          lest__ctx_section._8_4_ = lest__ctx_section._8_4_ - (uint)(lest__ctx_section._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_2,&relop<int,_int,_int>::id1331,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_2);
      if (bVar2) {
        lest__ctx_section_1.once = true;
        lest__ctx_section_1._9_3_ = 0;
        for (lest__ctx_section_1._12_4_ = 0;
            (int)lest__ctx_section_1._12_4_ < (int)lest__ctx_section_1._8_4_;
            lest__ctx_section_1._12_4_ = lest__ctx_section_1._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_398,"engaged    == disengaged",
                     (allocator<char> *)(score_1.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_378,lest_env,&local_398);
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_1.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_378), bVar2) {
            do {
              _Var3 = std::operator==((optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged,&e1);
              local_3d2 = (bool)(~_Var3 & 1);
              local_3d0 = (bool *)lest::expression_decomposer::operator<<(&local_3d1,&local_3d2);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3c8,(expression_lhs *)&local_3d0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3c8);
              if (bVar2) {
                local_471 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_420,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_421);
                lest::location::location(&local_400,&local_420,0x533);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_448,"!(e1 == d )",&local_449);
                std::__cxx11::string::string((string *)&local_470,(string *)&score_1);
                lest::failure::failure(pfVar8,&local_400,&local_448,&local_470);
                local_471 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_538,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_539);
                lest::location::location(&local_518,&local_538,0x533);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_560,"!(e1 == d )",&local_561);
                std::__cxx11::string::string((string *)&local_588,(string *)&score_1);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_4f0,&local_518,&local_560,&local_588,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_5a8,lest_env);
                lest::report(poVar1,&local_4f0,&local_5a8);
                std::__cxx11::string::~string((string *)&local_5a8);
                lest::passing::~passing((passing *)&local_4f0);
                std::__cxx11::string::~string((string *)&local_588);
                std::__cxx11::string::~string((string *)&local_560);
                std::allocator<char>::~allocator(&local_561);
                lest::location::~location(&local_518);
                std::__cxx11::string::~string((string *)&local_538);
                std::allocator<char>::~allocator(&local_539);
              }
              lest::result::~result((result *)local_3c8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_378);
          lest__ctx_section_1._8_4_ =
               lest__ctx_section_1._8_4_ - (uint)(lest__ctx_section_1._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_3,&relop<int,_int,_int>::id1332,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_3);
      if (bVar2) {
        lest__ctx_section_2.once = true;
        lest__ctx_section_2._9_3_ = 0;
        for (lest__ctx_section_2._12_4_ = 0;
            (int)lest__ctx_section_2._12_4_ < (int)lest__ctx_section_2._8_4_;
            lest__ctx_section_2._12_4_ = lest__ctx_section_2._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_668,"disengaged == engaged",
                     (allocator<char> *)(score_2.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_648,lest_env,&local_668);
          std::__cxx11::string::~string((string *)&local_668);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_2.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_648), bVar2) {
            do {
              _Var3 = std::operator==(&e1,(optional<int> *)
                                          &e2.super__Optional_base<int,_true,_true>._M_payload.
                                           super__Optional_payload_base<int>._M_engaged);
              local_6a2 = (bool)(~_Var3 & 1);
              local_6a0 = (bool *)lest::expression_decomposer::operator<<(&local_6a1,&local_6a2);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_698,(expression_lhs *)&local_6a0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_698);
              if (bVar2) {
                local_741 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6f1);
                lest::location::location(&local_6d0,&local_6f0,0x534);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_718,"!(d == e1)",&local_719);
                std::__cxx11::string::string((string *)&local_740,(string *)&score_2);
                lest::failure::failure(pfVar8,&local_6d0,&local_718,&local_740);
                local_741 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_808,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_809);
                lest::location::location(&local_7e8,&local_808,0x534);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_830,"!(d == e1)",&local_831);
                std::__cxx11::string::string((string *)&local_858,(string *)&score_2);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_7c0,&local_7e8,&local_830,&local_858,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_878,lest_env);
                lest::report(poVar1,&local_7c0,&local_878);
                std::__cxx11::string::~string((string *)&local_878);
                lest::passing::~passing((passing *)&local_7c0);
                std::__cxx11::string::~string((string *)&local_858);
                std::__cxx11::string::~string((string *)&local_830);
                std::allocator<char>::~allocator(&local_831);
                lest::location::~location(&local_7e8);
                std::__cxx11::string::~string((string *)&local_808);
                std::allocator<char>::~allocator(&local_809);
              }
              lest::result::~result((result *)local_698);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_648);
          lest__ctx_section_2._8_4_ =
               lest__ctx_section_2._8_4_ - (uint)(lest__ctx_section_2._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_4,&relop<int,_int,_int>::id1334,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_4);
      if (bVar2) {
        lest__ctx_section_3.once = true;
        lest__ctx_section_3._9_3_ = 0;
        for (lest__ctx_section_3._12_4_ = 0;
            (int)lest__ctx_section_3._12_4_ < (int)lest__ctx_section_3._8_4_;
            lest__ctx_section_3._12_4_ = lest__ctx_section_3._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_938,"engaged    != engaged",
                     (allocator<char> *)(score_3.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_918,lest_env,&local_938);
          std::__cxx11::string::~string((string *)&local_938);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_3.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_918), bVar2) {
            do {
              local_970 = (optional<int> *)
                          lest::expression_decomposer::operator<<
                                    (&local_971,
                                     (optional<int> *)
                                     &e2.super__Optional_base<int,_true,_true>._M_payload.
                                      super__Optional_payload_base<int>._M_engaged);
              lest::expression_lhs<std::optional<int>const&>::operator!=
                        ((result *)local_968,(expression_lhs<std::optional<int>const&> *)&local_970,
                         &local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_968);
              if (bVar2) {
                local_a11 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_9c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_9c1);
                lest::location::location(&local_9a0,&local_9c0,0x536);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_9e8,"e1 != e2",&local_9e9);
                std::__cxx11::string::string((string *)&local_a10,(string *)&score_3);
                lest::failure::failure(pfVar8,&local_9a0,&local_9e8,&local_a10);
                local_a11 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_ad8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_ad9);
                lest::location::location(&local_ab8,&local_ad8,0x536);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b00,"e1 != e2",&local_b01);
                std::__cxx11::string::string((string *)&local_b28,(string *)&score_3);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_a90,&local_ab8,&local_b00,&local_b28,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_b48,lest_env);
                lest::report(poVar1,&local_a90,&local_b48);
                std::__cxx11::string::~string((string *)&local_b48);
                lest::passing::~passing((passing *)&local_a90);
                std::__cxx11::string::~string((string *)&local_b28);
                std::__cxx11::string::~string((string *)&local_b00);
                std::allocator<char>::~allocator(&local_b01);
                lest::location::~location(&local_ab8);
                std::__cxx11::string::~string((string *)&local_ad8);
                std::allocator<char>::~allocator(&local_ad9);
              }
              lest::result::~result((result *)local_968);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_918);
          lest__ctx_section_3._8_4_ =
               lest__ctx_section_3._8_4_ - (uint)(lest__ctx_section_3._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_5,&relop<int,_int,_int>::id1335,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_5);
      if (bVar2) {
        lest__ctx_section_4.once = true;
        lest__ctx_section_4._9_3_ = 0;
        for (lest__ctx_section_4._12_4_ = 0;
            (int)lest__ctx_section_4._12_4_ < (int)lest__ctx_section_4._8_4_;
            lest__ctx_section_4._12_4_ = lest__ctx_section_4._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c08,"engaged    != disengaged",
                     (allocator<char> *)(score_4.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_be8,lest_env,&local_c08);
          std::__cxx11::string::~string((string *)&local_c08);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_4.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_be8), bVar2) {
            do {
              local_c40 = (optional<int> *)
                          lest::expression_decomposer::operator<<
                                    (&local_c41,
                                     (optional<int> *)
                                     &e2.super__Optional_base<int,_true,_true>._M_payload.
                                      super__Optional_payload_base<int>._M_engaged);
              lest::expression_lhs<std::optional<int>const&>::operator!=
                        ((result *)local_c38,(expression_lhs<std::optional<int>const&> *)&local_c40,
                         &e1);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_c38);
              if (bVar2) {
                local_ce1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_c90,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_c91);
                lest::location::location(&local_c70,&local_c90,0x537);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_cb8,"e1 != d",&local_cb9);
                std::__cxx11::string::string((string *)&local_ce0,(string *)&score_4);
                lest::failure::failure(pfVar8,&local_c70,&local_cb8,&local_ce0);
                local_ce1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_da8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_da9);
                lest::location::location(&local_d88,&local_da8,0x537);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_dd0,"e1 != d",&local_dd1);
                std::__cxx11::string::string((string *)&local_df8,(string *)&score_4);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_d60,&local_d88,&local_dd0,&local_df8,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_e18,lest_env);
                lest::report(poVar1,&local_d60,&local_e18);
                std::__cxx11::string::~string((string *)&local_e18);
                lest::passing::~passing((passing *)&local_d60);
                std::__cxx11::string::~string((string *)&local_df8);
                std::__cxx11::string::~string((string *)&local_dd0);
                std::allocator<char>::~allocator(&local_dd1);
                lest::location::~location(&local_d88);
                std::__cxx11::string::~string((string *)&local_da8);
                std::allocator<char>::~allocator(&local_da9);
              }
              lest::result::~result((result *)local_c38);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_be8);
          lest__ctx_section_4._8_4_ =
               lest__ctx_section_4._8_4_ - (uint)(lest__ctx_section_4._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_6,&relop<int,_int,_int>::id1336,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_6);
      if (bVar2) {
        lest__ctx_section_5.once = true;
        lest__ctx_section_5._9_3_ = 0;
        for (lest__ctx_section_5._12_4_ = 0;
            (int)lest__ctx_section_5._12_4_ < (int)lest__ctx_section_5._8_4_;
            lest__ctx_section_5._12_4_ = lest__ctx_section_5._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ed8,"disengaged != engaged",
                     (allocator<char> *)(score_5.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_eb8,lest_env,&local_ed8);
          std::__cxx11::string::~string((string *)&local_ed8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_5.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_eb8), bVar2) {
            do {
              local_f10 = (optional<int> *)lest::expression_decomposer::operator<<(&local_f11,&e1);
              lest::expression_lhs<std::optional<int>const&>::operator!=
                        ((result *)local_f08,(expression_lhs<std::optional<int>const&> *)&local_f10,
                         &local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_f08);
              if (bVar2) {
                local_fb1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f60,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_f61);
                lest::location::location(&local_f40,&local_f60,0x538);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f88,"d != e2",&local_f89);
                std::__cxx11::string::string((string *)&local_fb0,(string *)&score_5);
                lest::failure::failure(pfVar8,&local_f40,&local_f88,&local_fb0);
                local_fb1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1078,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1079);
                lest::location::location(&local_1058,&local_1078,0x538);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_10a0,"d != e2",&local_10a1);
                std::__cxx11::string::string((string *)&local_10c8,(string *)&score_5);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1030,&local_1058,&local_10a0,&local_10c8,bVar2);
                lest::env::context_abi_cxx11_(&local_10e8,lest_env);
                lest::report(poVar1,&local_1030,&local_10e8);
                std::__cxx11::string::~string((string *)&local_10e8);
                lest::passing::~passing((passing *)&local_1030);
                std::__cxx11::string::~string((string *)&local_10c8);
                std::__cxx11::string::~string((string *)&local_10a0);
                std::allocator<char>::~allocator(&local_10a1);
                lest::location::~location(&local_1058);
                std::__cxx11::string::~string((string *)&local_1078);
                std::allocator<char>::~allocator(&local_1079);
              }
              lest::result::~result((result *)local_f08);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_eb8);
          lest__ctx_section_5._8_4_ =
               lest__ctx_section_5._8_4_ - (uint)(lest__ctx_section_5._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_7,&relop<int,_int,_int>::id1338,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_7);
      if (bVar2) {
        lest__ctx_section_6.once = true;
        lest__ctx_section_6._9_3_ = 0;
        for (lest__ctx_section_6._12_4_ = 0;
            (int)lest__ctx_section_6._12_4_ < (int)lest__ctx_section_6._8_4_;
            lest__ctx_section_6._12_4_ = lest__ctx_section_6._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_11a8,"engaged    <  engaged",
                     (allocator<char> *)(score_6.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1188,lest_env,&local_11a8);
          std::__cxx11::string::~string((string *)&local_11a8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_6.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1188), bVar2) {
            do {
              local_11e0 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_11e1,
                                      (optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged);
              lest::expression_lhs<std::optional<int>const&>::operator<
                        ((result *)local_11d8,
                         (expression_lhs<std::optional<int>const&> *)&local_11e0,&local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_11d8);
              if (bVar2) {
                local_1281 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1230,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1231);
                lest::location::location(&local_1210,&local_1230,0x53a);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1258,"e1 < e2",&local_1259);
                std::__cxx11::string::string((string *)&local_1280,(string *)&score_6);
                lest::failure::failure(pfVar8,&local_1210,&local_1258,&local_1280);
                local_1281 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1348,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1349);
                lest::location::location(&local_1328,&local_1348,0x53a);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1370,"e1 < e2",&local_1371);
                std::__cxx11::string::string((string *)&local_1398,(string *)&score_6);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1300,&local_1328,&local_1370,&local_1398,bVar2);
                lest::env::context_abi_cxx11_(&local_13b8,lest_env);
                lest::report(poVar1,&local_1300,&local_13b8);
                std::__cxx11::string::~string((string *)&local_13b8);
                lest::passing::~passing((passing *)&local_1300);
                std::__cxx11::string::~string((string *)&local_1398);
                std::__cxx11::string::~string((string *)&local_1370);
                std::allocator<char>::~allocator(&local_1371);
                lest::location::~location(&local_1328);
                std::__cxx11::string::~string((string *)&local_1348);
                std::allocator<char>::~allocator(&local_1349);
              }
              lest::result::~result((result *)local_11d8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_1188);
          lest__ctx_section_6._8_4_ =
               lest__ctx_section_6._8_4_ - (uint)(lest__ctx_section_6._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_8,&relop<int,_int,_int>::id1339,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_8);
      if (bVar2) {
        lest__ctx_section_7.once = true;
        lest__ctx_section_7._9_3_ = 0;
        for (lest__ctx_section_7._12_4_ = 0;
            (int)lest__ctx_section_7._12_4_ < (int)lest__ctx_section_7._8_4_;
            lest__ctx_section_7._12_4_ = lest__ctx_section_7._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1478,"engaged    <  disengaged",
                     (allocator<char> *)(score_7.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1458,lest_env,&local_1478);
          std::__cxx11::string::~string((string *)&local_1478);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_7.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1458), bVar2) {
            do {
              _Var4 = std::enable_if<is_convertible<decltype(((std::declval<int_const&>)())<((std::
                      declval<int_const&>)())),bool>::value,bool>::type_std::operator<
                                ((optional<int> *)
                                 &e2.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int>._M_engaged,&e1);
              local_14b2 = (bool)(~_Var4 & 1);
              local_14b0 = (bool *)lest::expression_decomposer::operator<<(&local_14b1,&local_14b2);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_14a8,(expression_lhs *)&local_14b0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_14a8);
              if (bVar2) {
                local_1551 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1500,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1501);
                lest::location::location(&local_14e0,&local_1500,0x53b);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1528,"!(e1 < d )",&local_1529);
                std::__cxx11::string::string((string *)&local_1550,(string *)&score_7);
                lest::failure::failure(pfVar8,&local_14e0,&local_1528,&local_1550);
                local_1551 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1618,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1619);
                lest::location::location(&local_15f8,&local_1618,0x53b);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1640,"!(e1 < d )",&local_1641);
                std::__cxx11::string::string((string *)&local_1668,(string *)&score_7);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_15d0,&local_15f8,&local_1640,&local_1668,bVar2);
                lest::env::context_abi_cxx11_(&local_1688,lest_env);
                lest::report(poVar1,&local_15d0,&local_1688);
                std::__cxx11::string::~string((string *)&local_1688);
                lest::passing::~passing((passing *)&local_15d0);
                std::__cxx11::string::~string((string *)&local_1668);
                std::__cxx11::string::~string((string *)&local_1640);
                std::allocator<char>::~allocator(&local_1641);
                lest::location::~location(&local_15f8);
                std::__cxx11::string::~string((string *)&local_1618);
                std::allocator<char>::~allocator(&local_1619);
              }
              lest::result::~result((result *)local_14a8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_1458);
          lest__ctx_section_7._8_4_ =
               lest__ctx_section_7._8_4_ - (uint)(lest__ctx_section_7._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_9,&relop<int,_int,_int>::id1340,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_9);
      if (bVar2) {
        lest__ctx_section_8.once = true;
        lest__ctx_section_8._9_3_ = 0;
        for (lest__ctx_section_8._12_4_ = 0;
            (int)lest__ctx_section_8._12_4_ < (int)lest__ctx_section_8._8_4_;
            lest__ctx_section_8._12_4_ = lest__ctx_section_8._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1748,"disengaged <  engaged",
                     (allocator<char> *)(score_8.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1728,lest_env,&local_1748);
          std::__cxx11::string::~string((string *)&local_1748);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_8.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1728), bVar2) {
            do {
              local_1780 = (optional<int> *)lest::expression_decomposer::operator<<(&local_1781,&e1)
              ;
              lest::expression_lhs<std::optional<int>const&>::operator<
                        ((result *)local_1778,
                         (expression_lhs<std::optional<int>const&> *)&local_1780,&local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1778);
              if (bVar2) {
                local_1821 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_17d0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_17d1);
                lest::location::location(&local_17b0,&local_17d0,0x53c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_17f8,"d < e2",&local_17f9);
                std::__cxx11::string::string((string *)&local_1820,(string *)&score_8);
                lest::failure::failure(pfVar8,&local_17b0,&local_17f8,&local_1820);
                local_1821 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_18e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_18e9);
                lest::location::location(&local_18c8,&local_18e8,0x53c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1910,"d < e2",&local_1911);
                std::__cxx11::string::string((string *)&local_1938,(string *)&score_8);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_18a0,&local_18c8,&local_1910,&local_1938,bVar2);
                lest::env::context_abi_cxx11_(&local_1958,lest_env);
                lest::report(poVar1,&local_18a0,&local_1958);
                std::__cxx11::string::~string((string *)&local_1958);
                lest::passing::~passing((passing *)&local_18a0);
                std::__cxx11::string::~string((string *)&local_1938);
                std::__cxx11::string::~string((string *)&local_1910);
                std::allocator<char>::~allocator(&local_1911);
                lest::location::~location(&local_18c8);
                std::__cxx11::string::~string((string *)&local_18e8);
                std::allocator<char>::~allocator(&local_18e9);
              }
              lest::result::~result((result *)local_1778);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_1728);
          lest__ctx_section_8._8_4_ =
               lest__ctx_section_8._8_4_ - (uint)(lest__ctx_section_8._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_10,&relop<int,_int,_int>::id1342,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_10);
      if (bVar2) {
        lest__ctx_section_9.once = true;
        lest__ctx_section_9._9_3_ = 0;
        for (lest__ctx_section_9._12_4_ = 0;
            (int)lest__ctx_section_9._12_4_ < (int)lest__ctx_section_9._8_4_;
            lest__ctx_section_9._12_4_ = lest__ctx_section_9._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a18,"engaged    <= engaged",
                     (allocator<char> *)(score_9.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_19f8,lest_env,&local_1a18);
          std::__cxx11::string::~string((string *)&local_1a18);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_9.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_19f8), bVar2) {
            do {
              local_1a50 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_1a51,
                                      (optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged);
              lest::expression_lhs<std::optional<int>const&>::operator<=
                        ((result *)local_1a48,
                         (expression_lhs<std::optional<int>const&> *)&local_1a50,
                         (optional<int> *)
                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1a48);
              if (bVar2) {
                local_1af1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1aa0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1aa1);
                lest::location::location(&local_1a80,&local_1aa0,0x53e);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1ac8,"e1 <= e1",&local_1ac9);
                std::__cxx11::string::string((string *)&local_1af0,(string *)&score_9);
                lest::failure::failure(pfVar8,&local_1a80,&local_1ac8,&local_1af0);
                local_1af1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1bb8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1bb9);
                lest::location::location(&local_1b98,&local_1bb8,0x53e);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1be0,"e1 <= e1",&local_1be1);
                std::__cxx11::string::string((string *)&local_1c08,(string *)&score_9);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1b70,&local_1b98,&local_1be0,&local_1c08,bVar2);
                lest::env::context_abi_cxx11_(&local_1c28,lest_env);
                lest::report(poVar1,&local_1b70,&local_1c28);
                std::__cxx11::string::~string((string *)&local_1c28);
                lest::passing::~passing((passing *)&local_1b70);
                std::__cxx11::string::~string((string *)&local_1c08);
                std::__cxx11::string::~string((string *)&local_1be0);
                std::allocator<char>::~allocator(&local_1be1);
                lest::location::~location(&local_1b98);
                std::__cxx11::string::~string((string *)&local_1bb8);
                std::allocator<char>::~allocator(&local_1bb9);
              }
              lest::result::~result((result *)local_1a48);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_19f8);
          lest__ctx_section_9._8_4_ =
               lest__ctx_section_9._8_4_ - (uint)(lest__ctx_section_9._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_11,&relop<int,_int,_int>::id1343,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_11);
      if (bVar2) {
        lest__ctx_section_10.once = true;
        lest__ctx_section_10._9_3_ = 0;
        for (lest__ctx_section_10._12_4_ = 0;
            (int)lest__ctx_section_10._12_4_ < (int)lest__ctx_section_10._8_4_;
            lest__ctx_section_10._12_4_ = lest__ctx_section_10._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1ce8,"engaged    <= engaged",
                     (allocator<char> *)(score_10.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1cc8,lest_env,&local_1ce8);
          std::__cxx11::string::~string((string *)&local_1ce8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_10.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1cc8), bVar2) {
            do {
              local_1d20 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_1d21,
                                      (optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged);
              lest::expression_lhs<std::optional<int>const&>::operator<=
                        ((result *)local_1d18,
                         (expression_lhs<std::optional<int>const&> *)&local_1d20,&local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1d18);
              if (bVar2) {
                local_1dc1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1d70,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1d71);
                lest::location::location(&local_1d50,&local_1d70,0x53f);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1d98,"e1 <= e2",&local_1d99);
                std::__cxx11::string::string((string *)&local_1dc0,(string *)&score_10);
                lest::failure::failure(pfVar8,&local_1d50,&local_1d98,&local_1dc0);
                local_1dc1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1e88,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1e89);
                lest::location::location(&local_1e68,&local_1e88,0x53f);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1eb0,"e1 <= e2",&local_1eb1);
                std::__cxx11::string::string((string *)&local_1ed8,(string *)&score_10);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1e40,&local_1e68,&local_1eb0,&local_1ed8,bVar2);
                lest::env::context_abi_cxx11_(&local_1ef8,lest_env);
                lest::report(poVar1,&local_1e40,&local_1ef8);
                std::__cxx11::string::~string((string *)&local_1ef8);
                lest::passing::~passing((passing *)&local_1e40);
                std::__cxx11::string::~string((string *)&local_1ed8);
                std::__cxx11::string::~string((string *)&local_1eb0);
                std::allocator<char>::~allocator(&local_1eb1);
                lest::location::~location(&local_1e68);
                std::__cxx11::string::~string((string *)&local_1e88);
                std::allocator<char>::~allocator(&local_1e89);
              }
              lest::result::~result((result *)local_1d18);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_1cc8);
          lest__ctx_section_10._8_4_ =
               lest__ctx_section_10._8_4_ - (uint)(lest__ctx_section_10._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_12,&relop<int,_int,_int>::id1344,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_12);
      if (bVar2) {
        lest__ctx_section_11.once = true;
        lest__ctx_section_11._9_3_ = 0;
        for (lest__ctx_section_11._12_4_ = 0;
            (int)lest__ctx_section_11._12_4_ < (int)lest__ctx_section_11._8_4_;
            lest__ctx_section_11._12_4_ = lest__ctx_section_11._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1fb8,"engaged    <= disengaged",
                     (allocator<char> *)(score_11.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1f98,lest_env,&local_1fb8);
          std::__cxx11::string::~string((string *)&local_1fb8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_11.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1f98), bVar2) {
            do {
              _Var5 = std::enable_if<is_convertible<decltype(((std::declval<int_const&>)())<=((std::
                      declval<int_const&>)())),bool>::value,bool>::type_std::operator<=
                                ((optional<int> *)
                                 &e2.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int>._M_engaged,&e1);
              local_1ff2 = (bool)(~_Var5 & 1);
              local_1ff0 = (bool *)lest::expression_decomposer::operator<<(&local_1ff1,&local_1ff2);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_1fe8,(expression_lhs *)&local_1ff0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1fe8);
              if (bVar2) {
                local_2091 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2040,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2041);
                lest::location::location(&local_2020,&local_2040,0x540);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2068,"!(e1 <= d )",&local_2069);
                std::__cxx11::string::string((string *)&local_2090,(string *)&score_11);
                lest::failure::failure(pfVar8,&local_2020,&local_2068,&local_2090);
                local_2091 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2158,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2159);
                lest::location::location(&local_2138,&local_2158,0x540);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2180,"!(e1 <= d )",&local_2181);
                std::__cxx11::string::string((string *)&local_21a8,(string *)&score_11);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2110,&local_2138,&local_2180,&local_21a8,bVar2);
                lest::env::context_abi_cxx11_(&local_21c8,lest_env);
                lest::report(poVar1,&local_2110,&local_21c8);
                std::__cxx11::string::~string((string *)&local_21c8);
                lest::passing::~passing((passing *)&local_2110);
                std::__cxx11::string::~string((string *)&local_21a8);
                std::__cxx11::string::~string((string *)&local_2180);
                std::allocator<char>::~allocator(&local_2181);
                lest::location::~location(&local_2138);
                std::__cxx11::string::~string((string *)&local_2158);
                std::allocator<char>::~allocator(&local_2159);
              }
              lest::result::~result((result *)local_1fe8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_1f98);
          lest__ctx_section_11._8_4_ =
               lest__ctx_section_11._8_4_ - (uint)(lest__ctx_section_11._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_13,&relop<int,_int,_int>::id1345,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_13);
      if (bVar2) {
        lest__ctx_section_12.once = true;
        lest__ctx_section_12._9_3_ = 0;
        for (lest__ctx_section_12._12_4_ = 0;
            (int)lest__ctx_section_12._12_4_ < (int)lest__ctx_section_12._8_4_;
            lest__ctx_section_12._12_4_ = lest__ctx_section_12._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2288,"disengaged <= engaged",
                     (allocator<char> *)(score_12.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2268,lest_env,&local_2288);
          std::__cxx11::string::~string((string *)&local_2288);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_12.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2268), bVar2) {
            do {
              local_22c0 = (optional<int> *)lest::expression_decomposer::operator<<(&local_22c1,&e1)
              ;
              lest::expression_lhs<std::optional<int>const&>::operator<=
                        ((result *)local_22b8,
                         (expression_lhs<std::optional<int>const&> *)&local_22c0,&local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_22b8);
              if (bVar2) {
                local_2361 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2310,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2311);
                lest::location::location(&local_22f0,&local_2310,0x541);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2338,"d <= e2",&local_2339);
                std::__cxx11::string::string((string *)&local_2360,(string *)&score_12);
                lest::failure::failure(pfVar8,&local_22f0,&local_2338,&local_2360);
                local_2361 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2428,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2429);
                lest::location::location(&local_2408,&local_2428,0x541);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2450,"d <= e2",&local_2451);
                std::__cxx11::string::string((string *)&local_2478,(string *)&score_12);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_23e0,&local_2408,&local_2450,&local_2478,bVar2);
                lest::env::context_abi_cxx11_(&local_2498,lest_env);
                lest::report(poVar1,&local_23e0,&local_2498);
                std::__cxx11::string::~string((string *)&local_2498);
                lest::passing::~passing((passing *)&local_23e0);
                std::__cxx11::string::~string((string *)&local_2478);
                std::__cxx11::string::~string((string *)&local_2450);
                std::allocator<char>::~allocator(&local_2451);
                lest::location::~location(&local_2408);
                std::__cxx11::string::~string((string *)&local_2428);
                std::allocator<char>::~allocator(&local_2429);
              }
              lest::result::~result((result *)local_22b8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_2268);
          lest__ctx_section_12._8_4_ =
               lest__ctx_section_12._8_4_ - (uint)(lest__ctx_section_12._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_14,&relop<int,_int,_int>::id1347,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_14);
      if (bVar2) {
        lest__ctx_section_13.once = true;
        lest__ctx_section_13._9_3_ = 0;
        for (lest__ctx_section_13._12_4_ = 0;
            (int)lest__ctx_section_13._12_4_ < (int)lest__ctx_section_13._8_4_;
            lest__ctx_section_13._12_4_ = lest__ctx_section_13._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2558,"engaged    >  engaged",
                     (allocator<char> *)(score_13.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2538,lest_env,&local_2558);
          std::__cxx11::string::~string((string *)&local_2558);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_13.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2538), bVar2) {
            do {
              local_2590 = (optional<int> *)
                           lest::expression_decomposer::operator<<(&local_2591,&local_7c);
              lest::expression_lhs<std::optional<int>const&>::operator>
                        ((result *)local_2588,
                         (expression_lhs<std::optional<int>const&> *)&local_2590,
                         (optional<int> *)
                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2588);
              if (bVar2) {
                local_2631 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_25e0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_25e1);
                lest::location::location(&local_25c0,&local_25e0,0x543);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2608,"e2 > e1",&local_2609);
                std::__cxx11::string::string((string *)&local_2630,(string *)&score_13);
                lest::failure::failure(pfVar8,&local_25c0,&local_2608,&local_2630);
                local_2631 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_26f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_26f9);
                lest::location::location(&local_26d8,&local_26f8,0x543);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2720,"e2 > e1",&local_2721);
                std::__cxx11::string::string((string *)&local_2748,(string *)&score_13);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_26b0,&local_26d8,&local_2720,&local_2748,bVar2);
                lest::env::context_abi_cxx11_(&local_2768,lest_env);
                lest::report(poVar1,&local_26b0,&local_2768);
                std::__cxx11::string::~string((string *)&local_2768);
                lest::passing::~passing((passing *)&local_26b0);
                std::__cxx11::string::~string((string *)&local_2748);
                std::__cxx11::string::~string((string *)&local_2720);
                std::allocator<char>::~allocator(&local_2721);
                lest::location::~location(&local_26d8);
                std::__cxx11::string::~string((string *)&local_26f8);
                std::allocator<char>::~allocator(&local_26f9);
              }
              lest::result::~result((result *)local_2588);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_2538);
          lest__ctx_section_13._8_4_ =
               lest__ctx_section_13._8_4_ - (uint)(lest__ctx_section_13._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_15,&relop<int,_int,_int>::id1348,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_15);
      if (bVar2) {
        lest__ctx_section_14.once = true;
        lest__ctx_section_14._9_3_ = 0;
        for (lest__ctx_section_14._12_4_ = 0;
            (int)lest__ctx_section_14._12_4_ < (int)lest__ctx_section_14._8_4_;
            lest__ctx_section_14._12_4_ = lest__ctx_section_14._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2828,"engaged    >  disengaged",
                     (allocator<char> *)(score_14.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2808,lest_env,&local_2828);
          std::__cxx11::string::~string((string *)&local_2828);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_14.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2808), bVar2) {
            do {
              local_2860 = (optional<int> *)
                           lest::expression_decomposer::operator<<(&local_2861,&local_7c);
              lest::expression_lhs<std::optional<int>const&>::operator>
                        ((result *)local_2858,
                         (expression_lhs<std::optional<int>const&> *)&local_2860,&e1);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2858);
              if (bVar2) {
                local_2901 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_28b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_28b1);
                lest::location::location(&local_2890,&local_28b0,0x544);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_28d8,"e2 > d",&local_28d9);
                std::__cxx11::string::string((string *)&local_2900,(string *)&score_14);
                lest::failure::failure(pfVar8,&local_2890,&local_28d8,&local_2900);
                local_2901 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_29c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_29c9);
                lest::location::location(&local_29a8,&local_29c8,0x544);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_29f0,"e2 > d",&local_29f1);
                std::__cxx11::string::string((string *)&local_2a18,(string *)&score_14);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2980,&local_29a8,&local_29f0,&local_2a18,bVar2);
                lest::env::context_abi_cxx11_(&local_2a38,lest_env);
                lest::report(poVar1,&local_2980,&local_2a38);
                std::__cxx11::string::~string((string *)&local_2a38);
                lest::passing::~passing((passing *)&local_2980);
                std::__cxx11::string::~string((string *)&local_2a18);
                std::__cxx11::string::~string((string *)&local_29f0);
                std::allocator<char>::~allocator(&local_29f1);
                lest::location::~location(&local_29a8);
                std::__cxx11::string::~string((string *)&local_29c8);
                std::allocator<char>::~allocator(&local_29c9);
              }
              lest::result::~result((result *)local_2858);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_2808);
          lest__ctx_section_14._8_4_ =
               lest__ctx_section_14._8_4_ - (uint)(lest__ctx_section_14._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_16,&relop<int,_int,_int>::id1349,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_16);
      if (bVar2) {
        lest__ctx_section_15.once = true;
        lest__ctx_section_15._9_3_ = 0;
        for (lest__ctx_section_15._12_4_ = 0;
            (int)lest__ctx_section_15._12_4_ < (int)lest__ctx_section_15._8_4_;
            lest__ctx_section_15._12_4_ = lest__ctx_section_15._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2af8,"disengaged >  engaged",
                     (allocator<char> *)(score_15.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2ad8,lest_env,&local_2af8);
          std::__cxx11::string::~string((string *)&local_2af8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_15.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2ad8), bVar2) {
            do {
              _Var6 = std::operator>(&e1,(optional<int> *)
                                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                                          super__Optional_payload_base<int>._M_engaged);
              local_2b32 = (bool)(~_Var6 & 1);
              local_2b30 = (bool *)lest::expression_decomposer::operator<<(&local_2b31,&local_2b32);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_2b28,(expression_lhs *)&local_2b30);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2b28);
              if (bVar2) {
                local_2bd1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2b80,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2b81);
                lest::location::location(&local_2b60,&local_2b80,0x545);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2ba8,"!(d > e1)",&local_2ba9);
                std::__cxx11::string::string((string *)&local_2bd0,(string *)&score_15);
                lest::failure::failure(pfVar8,&local_2b60,&local_2ba8,&local_2bd0);
                local_2bd1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2c98,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2c99);
                lest::location::location(&local_2c78,&local_2c98,0x545);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2cc0,"!(d > e1)",&local_2cc1);
                std::__cxx11::string::string((string *)&local_2ce8,(string *)&score_15);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2c50,&local_2c78,&local_2cc0,&local_2ce8,bVar2);
                lest::env::context_abi_cxx11_(&local_2d08,lest_env);
                lest::report(poVar1,&local_2c50,&local_2d08);
                std::__cxx11::string::~string((string *)&local_2d08);
                lest::passing::~passing((passing *)&local_2c50);
                std::__cxx11::string::~string((string *)&local_2ce8);
                std::__cxx11::string::~string((string *)&local_2cc0);
                std::allocator<char>::~allocator(&local_2cc1);
                lest::location::~location(&local_2c78);
                std::__cxx11::string::~string((string *)&local_2c98);
                std::allocator<char>::~allocator(&local_2c99);
              }
              lest::result::~result((result *)local_2b28);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_2ad8);
          lest__ctx_section_15._8_4_ =
               lest__ctx_section_15._8_4_ - (uint)(lest__ctx_section_15._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_17,&relop<int,_int,_int>::id1351,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_17);
      if (bVar2) {
        lest__ctx_section_16.once = true;
        lest__ctx_section_16._9_3_ = 0;
        for (lest__ctx_section_16._12_4_ = 0;
            (int)lest__ctx_section_16._12_4_ < (int)lest__ctx_section_16._8_4_;
            lest__ctx_section_16._12_4_ = lest__ctx_section_16._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2dc8,"engaged    >= engaged",
                     (allocator<char> *)(score_16.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2da8,lest_env,&local_2dc8);
          std::__cxx11::string::~string((string *)&local_2dc8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_16.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2da8), bVar2) {
            do {
              local_2e00 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_2e01,
                                      (optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged);
              lest::expression_lhs<std::optional<int>const&>::operator>=
                        ((result *)local_2df8,
                         (expression_lhs<std::optional<int>const&> *)&local_2e00,
                         (optional<int> *)
                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2df8);
              if (bVar2) {
                local_2ea1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2e50,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2e51);
                lest::location::location(&local_2e30,&local_2e50,0x547);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2e78,"e1 >= e1",&local_2e79);
                std::__cxx11::string::string((string *)&local_2ea0,(string *)&score_16);
                lest::failure::failure(pfVar8,&local_2e30,&local_2e78,&local_2ea0);
                local_2ea1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f68,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2f69);
                lest::location::location(&local_2f48,&local_2f68,0x547);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f90,"e1 >= e1",&local_2f91);
                std::__cxx11::string::string((string *)&local_2fb8,(string *)&score_16);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2f20,&local_2f48,&local_2f90,&local_2fb8,bVar2);
                lest::env::context_abi_cxx11_(&local_2fd8,lest_env);
                lest::report(poVar1,&local_2f20,&local_2fd8);
                std::__cxx11::string::~string((string *)&local_2fd8);
                lest::passing::~passing((passing *)&local_2f20);
                std::__cxx11::string::~string((string *)&local_2fb8);
                std::__cxx11::string::~string((string *)&local_2f90);
                std::allocator<char>::~allocator(&local_2f91);
                lest::location::~location(&local_2f48);
                std::__cxx11::string::~string((string *)&local_2f68);
                std::allocator<char>::~allocator(&local_2f69);
              }
              lest::result::~result((result *)local_2df8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_2da8);
          lest__ctx_section_16._8_4_ =
               lest__ctx_section_16._8_4_ - (uint)(lest__ctx_section_16._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_18,&relop<int,_int,_int>::id1352,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_18);
      if (bVar2) {
        lest__ctx_section_17.once = true;
        lest__ctx_section_17._9_3_ = 0;
        for (lest__ctx_section_17._12_4_ = 0;
            (int)lest__ctx_section_17._12_4_ < (int)lest__ctx_section_17._8_4_;
            lest__ctx_section_17._12_4_ = lest__ctx_section_17._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3098,"engaged    >= engaged",
                     (allocator<char> *)(score_17.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3078,lest_env,&local_3098);
          std::__cxx11::string::~string((string *)&local_3098);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_17.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3078), bVar2) {
            do {
              local_30d0 = (optional<int> *)
                           lest::expression_decomposer::operator<<(&local_30d1,&local_7c);
              lest::expression_lhs<std::optional<int>const&>::operator>=
                        ((result *)local_30c8,
                         (expression_lhs<std::optional<int>const&> *)&local_30d0,
                         (optional<int> *)
                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_30c8);
              if (bVar2) {
                local_3171 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3120,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3121);
                lest::location::location(&local_3100,&local_3120,0x548);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3148,"e2 >= e1",&local_3149);
                std::__cxx11::string::string((string *)&local_3170,(string *)&score_17);
                lest::failure::failure(pfVar8,&local_3100,&local_3148,&local_3170);
                local_3171 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3238,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3239);
                lest::location::location(&local_3218,&local_3238,0x548);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3260,"e2 >= e1",&local_3261);
                std::__cxx11::string::string((string *)&local_3288,(string *)&score_17);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_31f0,&local_3218,&local_3260,&local_3288,bVar2);
                lest::env::context_abi_cxx11_(&local_32a8,lest_env);
                lest::report(poVar1,&local_31f0,&local_32a8);
                std::__cxx11::string::~string((string *)&local_32a8);
                lest::passing::~passing((passing *)&local_31f0);
                std::__cxx11::string::~string((string *)&local_3288);
                std::__cxx11::string::~string((string *)&local_3260);
                std::allocator<char>::~allocator(&local_3261);
                lest::location::~location(&local_3218);
                std::__cxx11::string::~string((string *)&local_3238);
                std::allocator<char>::~allocator(&local_3239);
              }
              lest::result::~result((result *)local_30c8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_3078);
          lest__ctx_section_17._8_4_ =
               lest__ctx_section_17._8_4_ - (uint)(lest__ctx_section_17._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_19,&relop<int,_int,_int>::id1353,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_19);
      if (bVar2) {
        lest__ctx_section_18.once = true;
        lest__ctx_section_18._9_3_ = 0;
        for (lest__ctx_section_18._12_4_ = 0;
            (int)lest__ctx_section_18._12_4_ < (int)lest__ctx_section_18._8_4_;
            lest__ctx_section_18._12_4_ = lest__ctx_section_18._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3368,"engaged    >= disengaged",
                     (allocator<char> *)(score_18.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3348,lest_env,&local_3368);
          std::__cxx11::string::~string((string *)&local_3368);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_18.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3348), bVar2) {
            do {
              local_33a0 = (optional<int> *)
                           lest::expression_decomposer::operator<<(&local_33a1,&local_7c);
              lest::expression_lhs<std::optional<int>const&>::operator>=
                        ((result *)local_3398,
                         (expression_lhs<std::optional<int>const&> *)&local_33a0,&e1);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3398);
              if (bVar2) {
                local_3441 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_33f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_33f1);
                lest::location::location(&local_33d0,&local_33f0,0x549);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3418,"e2 >= d",&local_3419);
                std::__cxx11::string::string((string *)&local_3440,(string *)&score_18);
                lest::failure::failure(pfVar8,&local_33d0,&local_3418,&local_3440);
                local_3441 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3508,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3509);
                lest::location::location(&local_34e8,&local_3508,0x549);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3530,"e2 >= d",&local_3531);
                std::__cxx11::string::string((string *)&local_3558,(string *)&score_18);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_34c0,&local_34e8,&local_3530,&local_3558,bVar2);
                lest::env::context_abi_cxx11_(&local_3578,lest_env);
                lest::report(poVar1,&local_34c0,&local_3578);
                std::__cxx11::string::~string((string *)&local_3578);
                lest::passing::~passing((passing *)&local_34c0);
                std::__cxx11::string::~string((string *)&local_3558);
                std::__cxx11::string::~string((string *)&local_3530);
                std::allocator<char>::~allocator(&local_3531);
                lest::location::~location(&local_34e8);
                std::__cxx11::string::~string((string *)&local_3508);
                std::allocator<char>::~allocator(&local_3509);
              }
              lest::result::~result((result *)local_3398);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_3348);
          lest__ctx_section_18._8_4_ =
               lest__ctx_section_18._8_4_ - (uint)(lest__ctx_section_18._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_20,&relop<int,_int,_int>::id1354,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_20);
      if (bVar2) {
        lest__ctx_section_19.once = true;
        lest__ctx_section_19._9_3_ = 0;
        for (lest__ctx_section_19._12_4_ = 0;
            (int)lest__ctx_section_19._12_4_ < (int)lest__ctx_section_19._8_4_;
            lest__ctx_section_19._12_4_ = lest__ctx_section_19._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3638,"disengaged >= engaged",
                     (allocator<char> *)(score_19.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3618,lest_env,&local_3638);
          std::__cxx11::string::~string((string *)&local_3638);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_19.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3618), bVar2) {
            do {
              _Var7 = std::operator>=(&e1,(optional<int> *)
                                          &e2.super__Optional_base<int,_true,_true>._M_payload.
                                           super__Optional_payload_base<int>._M_engaged);
              local_3672 = (bool)(~_Var7 & 1);
              local_3670 = (bool *)lest::expression_decomposer::operator<<(&local_3671,&local_3672);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3668,(expression_lhs *)&local_3670);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3668);
              if (bVar2) {
                local_3711 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_36c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_36c1);
                lest::location::location(&local_36a0,&local_36c0,0x54a);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_36e8,"!(d >= e1)",&local_36e9);
                std::__cxx11::string::string((string *)&local_3710,(string *)&score_19);
                lest::failure::failure(pfVar8,&local_36a0,&local_36e8,&local_3710);
                local_3711 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_37d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_37d9);
                lest::location::location(&local_37b8,&local_37d8,0x54a);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3800,"!(d >= e1)",&local_3801);
                std::__cxx11::string::string((string *)&local_3828,(string *)&score_19);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3790,&local_37b8,&local_3800,&local_3828,bVar2);
                lest::env::context_abi_cxx11_(&local_3848,lest_env);
                lest::report(poVar1,&local_3790,&local_3848);
                std::__cxx11::string::~string((string *)&local_3848);
                lest::passing::~passing((passing *)&local_3790);
                std::__cxx11::string::~string((string *)&local_3828);
                std::__cxx11::string::~string((string *)&local_3800);
                std::allocator<char>::~allocator(&local_3801);
                lest::location::~location(&local_37b8);
                std::__cxx11::string::~string((string *)&local_37d8);
                std::allocator<char>::~allocator(&local_37d9);
              }
              lest::result::~result((result *)local_3668);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_3618);
          lest__ctx_section_19._8_4_ =
               lest__ctx_section_19._8_4_ - (uint)(lest__ctx_section_19._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_21,&relop<int,_int,_int>::id1356,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_21);
      if (bVar2) {
        lest__ctx_section_20.once = true;
        lest__ctx_section_20._9_3_ = 0;
        for (lest__ctx_section_20._12_4_ = 0;
            (int)lest__ctx_section_20._12_4_ < (int)lest__ctx_section_20._8_4_;
            lest__ctx_section_20._12_4_ = lest__ctx_section_20._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3908,"disengaged == nullopt",
                     (allocator<char> *)(score_20.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_38e8,lest_env,&local_3908);
          std::__cxx11::string::~string((string *)&local_3908);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_20.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_38e8), bVar2) {
            do {
              local_3942 = std::operator==(&e1);
              local_3940 = (bool *)lest::expression_decomposer::operator<<(&local_3941,&local_3942);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3938,(expression_lhs *)&local_3940);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3938);
              if (bVar2) {
                local_39e1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3990,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3991);
                lest::location::location(&local_3970,&local_3990,0x54c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_39b8,"(d == nullopt)",&local_39b9);
                std::__cxx11::string::string((string *)&local_39e0,(string *)&score_20);
                lest::failure::failure(pfVar8,&local_3970,&local_39b8,&local_39e0);
                local_39e1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3aa8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3aa9);
                lest::location::location(&local_3a88,&local_3aa8,0x54c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3ad0,"(d == nullopt)",&local_3ad1);
                std::__cxx11::string::string((string *)&local_3af8,(string *)&score_20);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3a60,&local_3a88,&local_3ad0,&local_3af8,bVar2);
                lest::env::context_abi_cxx11_(&local_3b18,lest_env);
                lest::report(poVar1,&local_3a60,&local_3b18);
                std::__cxx11::string::~string((string *)&local_3b18);
                lest::passing::~passing((passing *)&local_3a60);
                std::__cxx11::string::~string((string *)&local_3af8);
                std::__cxx11::string::~string((string *)&local_3ad0);
                std::allocator<char>::~allocator(&local_3ad1);
                lest::location::~location(&local_3a88);
                std::__cxx11::string::~string((string *)&local_3aa8);
                std::allocator<char>::~allocator(&local_3aa9);
              }
              lest::result::~result((result *)local_3938);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_38e8);
          lest__ctx_section_20._8_4_ =
               lest__ctx_section_20._8_4_ - (uint)(lest__ctx_section_20._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_22,&relop<int,_int,_int>::id1357,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_22);
      if (bVar2) {
        lest__ctx_section_21.once = true;
        lest__ctx_section_21._9_3_ = 0;
        for (lest__ctx_section_21._12_4_ = 0;
            (int)lest__ctx_section_21._12_4_ < (int)lest__ctx_section_21._8_4_;
            lest__ctx_section_21._12_4_ = lest__ctx_section_21._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3bd8,"nullopt    == disengaged",
                     (allocator<char> *)(score_21.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3bb8,lest_env,&local_3bd8);
          std::__cxx11::string::~string((string *)&local_3bd8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_21.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3bb8), bVar2) {
            do {
              local_3c12 = std::operator==(&e1);
              local_3c10 = (bool *)lest::expression_decomposer::operator<<(&local_3c11,&local_3c12);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3c08,(expression_lhs *)&local_3c10);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3c08);
              if (bVar2) {
                local_3cb1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3c60,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3c61);
                lest::location::location(&local_3c40,&local_3c60,0x54d);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3c88,"(nullopt == d )",&local_3c89);
                std::__cxx11::string::string((string *)&local_3cb0,(string *)&score_21);
                lest::failure::failure(pfVar8,&local_3c40,&local_3c88,&local_3cb0);
                local_3cb1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3d78,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3d79);
                lest::location::location(&local_3d58,&local_3d78,0x54d);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3da0,"(nullopt == d )",&local_3da1);
                std::__cxx11::string::string((string *)&local_3dc8,(string *)&score_21);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3d30,&local_3d58,&local_3da0,&local_3dc8,bVar2);
                lest::env::context_abi_cxx11_(&local_3de8,lest_env);
                lest::report(poVar1,&local_3d30,&local_3de8);
                std::__cxx11::string::~string((string *)&local_3de8);
                lest::passing::~passing((passing *)&local_3d30);
                std::__cxx11::string::~string((string *)&local_3dc8);
                std::__cxx11::string::~string((string *)&local_3da0);
                std::allocator<char>::~allocator(&local_3da1);
                lest::location::~location(&local_3d58);
                std::__cxx11::string::~string((string *)&local_3d78);
                std::allocator<char>::~allocator(&local_3d79);
              }
              lest::result::~result((result *)local_3c08);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_3bb8);
          lest__ctx_section_21._8_4_ =
               lest__ctx_section_21._8_4_ - (uint)(lest__ctx_section_21._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_23,&relop<int,_int,_int>::id1358,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_23);
      if (bVar2) {
        lest__ctx_section_22.once = true;
        lest__ctx_section_22._9_3_ = 0;
        for (lest__ctx_section_22._12_4_ = 0;
            (int)lest__ctx_section_22._12_4_ < (int)lest__ctx_section_22._8_4_;
            lest__ctx_section_22._12_4_ = lest__ctx_section_22._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3ea8,"engaged    == nullopt",
                     (allocator<char> *)(score_22.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3e88,lest_env,&local_3ea8);
          std::__cxx11::string::~string((string *)&local_3ea8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_22.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3e88), bVar2) {
            do {
              local_3ee2 = std::operator!=(&e2.super__Optional_base<int,_true,_true>._M_payload.
                                            super__Optional_payload_base<int>._M_engaged);
              local_3ee0 = (bool *)lest::expression_decomposer::operator<<(&local_3ee1,&local_3ee2);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3ed8,(expression_lhs *)&local_3ee0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3ed8);
              if (bVar2) {
                local_3f81 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3f30,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3f31);
                lest::location::location(&local_3f10,&local_3f30,0x54e);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3f58,"(e1 != nullopt)",&local_3f59);
                std::__cxx11::string::string((string *)&local_3f80,(string *)&score_22);
                lest::failure::failure(pfVar8,&local_3f10,&local_3f58,&local_3f80);
                local_3f81 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4048,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4049);
                lest::location::location(&local_4028,&local_4048,0x54e);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4070,"(e1 != nullopt)",&local_4071);
                std::__cxx11::string::string((string *)&local_4098,(string *)&score_22);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4000,&local_4028,&local_4070,&local_4098,bVar2);
                lest::env::context_abi_cxx11_(&local_40b8,lest_env);
                lest::report(poVar1,&local_4000,&local_40b8);
                std::__cxx11::string::~string((string *)&local_40b8);
                lest::passing::~passing((passing *)&local_4000);
                std::__cxx11::string::~string((string *)&local_4098);
                std::__cxx11::string::~string((string *)&local_4070);
                std::allocator<char>::~allocator(&local_4071);
                lest::location::~location(&local_4028);
                std::__cxx11::string::~string((string *)&local_4048);
                std::allocator<char>::~allocator(&local_4049);
              }
              lest::result::~result((result *)local_3ed8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_3e88);
          lest__ctx_section_22._8_4_ =
               lest__ctx_section_22._8_4_ - (uint)(lest__ctx_section_22._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_24,&relop<int,_int,_int>::id1359,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_24);
      if (bVar2) {
        lest__ctx_section_23.once = true;
        lest__ctx_section_23._9_3_ = 0;
        for (lest__ctx_section_23._12_4_ = 0;
            (int)lest__ctx_section_23._12_4_ < (int)lest__ctx_section_23._8_4_;
            lest__ctx_section_23._12_4_ = lest__ctx_section_23._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4178,"nullopt    == engaged",
                     (allocator<char> *)(score_23.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4158,lest_env,&local_4178);
          std::__cxx11::string::~string((string *)&local_4178);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_23.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4158), bVar2) {
            do {
              local_41b2 = std::operator!=(&e2.super__Optional_base<int,_true,_true>._M_payload.
                                            super__Optional_payload_base<int>._M_engaged);
              local_41b0 = (bool *)lest::expression_decomposer::operator<<(&local_41b1,&local_41b2);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_41a8,(expression_lhs *)&local_41b0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_41a8);
              if (bVar2) {
                local_4251 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4200,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4201);
                lest::location::location(&local_41e0,&local_4200,0x54f);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4228,"(nullopt != e1 )",&local_4229);
                std::__cxx11::string::string((string *)&local_4250,(string *)&score_23);
                lest::failure::failure(pfVar8,&local_41e0,&local_4228,&local_4250);
                local_4251 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4318,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4319);
                lest::location::location(&local_42f8,&local_4318,0x54f);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4340,"(nullopt != e1 )",&local_4341);
                std::__cxx11::string::string((string *)&local_4368,(string *)&score_23);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_42d0,&local_42f8,&local_4340,&local_4368,bVar2);
                lest::env::context_abi_cxx11_(&local_4388,lest_env);
                lest::report(poVar1,&local_42d0,&local_4388);
                std::__cxx11::string::~string((string *)&local_4388);
                lest::passing::~passing((passing *)&local_42d0);
                std::__cxx11::string::~string((string *)&local_4368);
                std::__cxx11::string::~string((string *)&local_4340);
                std::allocator<char>::~allocator(&local_4341);
                lest::location::~location(&local_42f8);
                std::__cxx11::string::~string((string *)&local_4318);
                std::allocator<char>::~allocator(&local_4319);
              }
              lest::result::~result((result *)local_41a8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_4158);
          lest__ctx_section_23._8_4_ =
               lest__ctx_section_23._8_4_ - (uint)(lest__ctx_section_23._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_25,&relop<int,_int,_int>::id1360,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_25);
      if (bVar2) {
        lest__ctx_section_24.once = true;
        lest__ctx_section_24._9_3_ = 0;
        for (lest__ctx_section_24._12_4_ = 0;
            (int)lest__ctx_section_24._12_4_ < (int)lest__ctx_section_24._8_4_;
            lest__ctx_section_24._12_4_ = lest__ctx_section_24._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4448,"disengaged == nullopt",
                     (allocator<char> *)(score_24.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4428,lest_env,&local_4448);
          std::__cxx11::string::~string((string *)&local_4448);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_24.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4428), bVar2) {
            do {
              local_4482 = std::operator<(&e1);
              local_4482 = !local_4482;
              local_4480 = (bool *)lest::expression_decomposer::operator<<(&local_4481,&local_4482);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4478,(expression_lhs *)&local_4480);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4478);
              if (bVar2) {
                local_4521 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_44d0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_44d1);
                lest::location::location(&local_44b0,&local_44d0,0x550);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_44f8,"!(d < nullopt)",&local_44f9);
                std::__cxx11::string::string((string *)&local_4520,(string *)&score_24);
                lest::failure::failure(pfVar8,&local_44b0,&local_44f8,&local_4520);
                local_4521 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_45e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_45e9);
                lest::location::location(&local_45c8,&local_45e8,0x550);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4610,"!(d < nullopt)",&local_4611);
                std::__cxx11::string::string((string *)&local_4638,(string *)&score_24);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_45a0,&local_45c8,&local_4610,&local_4638,bVar2);
                lest::env::context_abi_cxx11_(&local_4658,lest_env);
                lest::report(poVar1,&local_45a0,&local_4658);
                std::__cxx11::string::~string((string *)&local_4658);
                lest::passing::~passing((passing *)&local_45a0);
                std::__cxx11::string::~string((string *)&local_4638);
                std::__cxx11::string::~string((string *)&local_4610);
                std::allocator<char>::~allocator(&local_4611);
                lest::location::~location(&local_45c8);
                std::__cxx11::string::~string((string *)&local_45e8);
                std::allocator<char>::~allocator(&local_45e9);
              }
              lest::result::~result((result *)local_4478);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_4428);
          lest__ctx_section_24._8_4_ =
               lest__ctx_section_24._8_4_ - (uint)(lest__ctx_section_24._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_26,&relop<int,_int,_int>::id1361,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_26);
      if (bVar2) {
        lest__ctx_section_25.once = true;
        lest__ctx_section_25._9_3_ = 0;
        for (lest__ctx_section_25._12_4_ = 0;
            (int)lest__ctx_section_25._12_4_ < (int)lest__ctx_section_25._8_4_;
            lest__ctx_section_25._12_4_ = lest__ctx_section_25._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4718,"nullopt    == disengaged",
                     (allocator<char> *)(score_25.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_46f8,lest_env,&local_4718);
          std::__cxx11::string::~string((string *)&local_4718);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_25.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_46f8), bVar2) {
            do {
              local_4752 = std::operator<(&e1);
              local_4752 = !local_4752;
              local_4750 = (bool *)lest::expression_decomposer::operator<<(&local_4751,&local_4752);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4748,(expression_lhs *)&local_4750);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4748);
              if (bVar2) {
                local_47f1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_47a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_47a1);
                lest::location::location(&local_4780,&local_47a0,0x551);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_47c8,"!(nullopt < d )",&local_47c9);
                std::__cxx11::string::string((string *)&local_47f0,(string *)&score_25);
                lest::failure::failure(pfVar8,&local_4780,&local_47c8,&local_47f0);
                local_47f1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_48b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_48b9);
                lest::location::location(&local_4898,&local_48b8,0x551);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_48e0,"!(nullopt < d )",&local_48e1);
                std::__cxx11::string::string((string *)&local_4908,(string *)&score_25);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4870,&local_4898,&local_48e0,&local_4908,bVar2);
                lest::env::context_abi_cxx11_(&local_4928,lest_env);
                lest::report(poVar1,&local_4870,&local_4928);
                std::__cxx11::string::~string((string *)&local_4928);
                lest::passing::~passing((passing *)&local_4870);
                std::__cxx11::string::~string((string *)&local_4908);
                std::__cxx11::string::~string((string *)&local_48e0);
                std::allocator<char>::~allocator(&local_48e1);
                lest::location::~location(&local_4898);
                std::__cxx11::string::~string((string *)&local_48b8);
                std::allocator<char>::~allocator(&local_48b9);
              }
              lest::result::~result((result *)local_4748);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_46f8);
          lest__ctx_section_25._8_4_ =
               lest__ctx_section_25._8_4_ - (uint)(lest__ctx_section_25._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_27,&relop<int,_int,_int>::id1362,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_27);
      if (bVar2) {
        lest__ctx_section_26.once = true;
        lest__ctx_section_26._9_3_ = 0;
        for (lest__ctx_section_26._12_4_ = 0;
            (int)lest__ctx_section_26._12_4_ < (int)lest__ctx_section_26._8_4_;
            lest__ctx_section_26._12_4_ = lest__ctx_section_26._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_49e8,"disengaged == nullopt",
                     (allocator<char> *)(score_26.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_49c8,lest_env,&local_49e8);
          std::__cxx11::string::~string((string *)&local_49e8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_26.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_49c8), bVar2) {
            do {
              local_4a22 = std::operator<=(&e1);
              local_4a20 = (bool *)lest::expression_decomposer::operator<<(&local_4a21,&local_4a22);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4a18,(expression_lhs *)&local_4a20);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4a18);
              if (bVar2) {
                local_4ac1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4a70,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4a71);
                lest::location::location(&local_4a50,&local_4a70,0x552);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4a98,"(d <= nullopt)",&local_4a99);
                std::__cxx11::string::string((string *)&local_4ac0,(string *)&score_26);
                lest::failure::failure(pfVar8,&local_4a50,&local_4a98,&local_4ac0);
                local_4ac1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4b88,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4b89);
                lest::location::location(&local_4b68,&local_4b88,0x552);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4bb0,"(d <= nullopt)",&local_4bb1);
                std::__cxx11::string::string((string *)&local_4bd8,(string *)&score_26);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4b40,&local_4b68,&local_4bb0,&local_4bd8,bVar2);
                lest::env::context_abi_cxx11_(&local_4bf8,lest_env);
                lest::report(poVar1,&local_4b40,&local_4bf8);
                std::__cxx11::string::~string((string *)&local_4bf8);
                lest::passing::~passing((passing *)&local_4b40);
                std::__cxx11::string::~string((string *)&local_4bd8);
                std::__cxx11::string::~string((string *)&local_4bb0);
                std::allocator<char>::~allocator(&local_4bb1);
                lest::location::~location(&local_4b68);
                std::__cxx11::string::~string((string *)&local_4b88);
                std::allocator<char>::~allocator(&local_4b89);
              }
              lest::result::~result((result *)local_4a18);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_49c8);
          lest__ctx_section_26._8_4_ =
               lest__ctx_section_26._8_4_ - (uint)(lest__ctx_section_26._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_28,&relop<int,_int,_int>::id1363,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_28);
      if (bVar2) {
        lest__ctx_section_27.once = true;
        lest__ctx_section_27._9_3_ = 0;
        for (lest__ctx_section_27._12_4_ = 0;
            (int)lest__ctx_section_27._12_4_ < (int)lest__ctx_section_27._8_4_;
            lest__ctx_section_27._12_4_ = lest__ctx_section_27._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4cb8,"nullopt    == disengaged",
                     (allocator<char> *)(score_27.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4c98,lest_env,&local_4cb8);
          std::__cxx11::string::~string((string *)&local_4cb8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_27.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4c98), bVar2) {
            do {
              local_4cf2 = std::operator<=(&e1);
              local_4cf0 = (bool *)lest::expression_decomposer::operator<<(&local_4cf1,&local_4cf2);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4ce8,(expression_lhs *)&local_4cf0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4ce8);
              if (bVar2) {
                local_4d91 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4d40,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4d41);
                lest::location::location(&local_4d20,&local_4d40,0x553);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4d68,"(nullopt <= d )",&local_4d69);
                std::__cxx11::string::string((string *)&local_4d90,(string *)&score_27);
                lest::failure::failure(pfVar8,&local_4d20,&local_4d68,&local_4d90);
                local_4d91 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4e58,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4e59);
                lest::location::location(&local_4e38,&local_4e58,0x553);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4e80,"(nullopt <= d )",&local_4e81);
                std::__cxx11::string::string((string *)&local_4ea8,(string *)&score_27);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4e10,&local_4e38,&local_4e80,&local_4ea8,bVar2);
                lest::env::context_abi_cxx11_(&local_4ec8,lest_env);
                lest::report(poVar1,&local_4e10,&local_4ec8);
                std::__cxx11::string::~string((string *)&local_4ec8);
                lest::passing::~passing((passing *)&local_4e10);
                std::__cxx11::string::~string((string *)&local_4ea8);
                std::__cxx11::string::~string((string *)&local_4e80);
                std::allocator<char>::~allocator(&local_4e81);
                lest::location::~location(&local_4e38);
                std::__cxx11::string::~string((string *)&local_4e58);
                std::allocator<char>::~allocator(&local_4e59);
              }
              lest::result::~result((result *)local_4ce8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_4c98);
          lest__ctx_section_27._8_4_ =
               lest__ctx_section_27._8_4_ - (uint)(lest__ctx_section_27._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_29,&relop<int,_int,_int>::id1364,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_29);
      if (bVar2) {
        lest__ctx_section_28.once = true;
        lest__ctx_section_28._9_3_ = 0;
        for (lest__ctx_section_28._12_4_ = 0;
            (int)lest__ctx_section_28._12_4_ < (int)lest__ctx_section_28._8_4_;
            lest__ctx_section_28._12_4_ = lest__ctx_section_28._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f88,"disengaged == nullopt",
                     (allocator<char> *)(score_28.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4f68,lest_env,&local_4f88);
          std::__cxx11::string::~string((string *)&local_4f88);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_28.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4f68), bVar2) {
            do {
              local_4fc2 = std::operator>(&e1);
              local_4fc2 = !local_4fc2;
              local_4fc0 = (bool *)lest::expression_decomposer::operator<<(&local_4fc1,&local_4fc2);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4fb8,(expression_lhs *)&local_4fc0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4fb8);
              if (bVar2) {
                local_5061 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5010,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5011);
                lest::location::location(&local_4ff0,&local_5010,0x554);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5038,"!(d > nullopt)",&local_5039);
                std::__cxx11::string::string((string *)&local_5060,(string *)&score_28);
                lest::failure::failure(pfVar8,&local_4ff0,&local_5038,&local_5060);
                local_5061 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5128,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5129);
                lest::location::location(&local_5108,&local_5128,0x554);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5150,"!(d > nullopt)",&local_5151);
                std::__cxx11::string::string((string *)&local_5178,(string *)&score_28);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_50e0,&local_5108,&local_5150,&local_5178,bVar2);
                lest::env::context_abi_cxx11_(&local_5198,lest_env);
                lest::report(poVar1,&local_50e0,&local_5198);
                std::__cxx11::string::~string((string *)&local_5198);
                lest::passing::~passing((passing *)&local_50e0);
                std::__cxx11::string::~string((string *)&local_5178);
                std::__cxx11::string::~string((string *)&local_5150);
                std::allocator<char>::~allocator(&local_5151);
                lest::location::~location(&local_5108);
                std::__cxx11::string::~string((string *)&local_5128);
                std::allocator<char>::~allocator(&local_5129);
              }
              lest::result::~result((result *)local_4fb8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_4f68);
          lest__ctx_section_28._8_4_ =
               lest__ctx_section_28._8_4_ - (uint)(lest__ctx_section_28._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_30,&relop<int,_int,_int>::id1365,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_30);
      if (bVar2) {
        lest__ctx_section_29.once = true;
        lest__ctx_section_29._9_3_ = 0;
        for (lest__ctx_section_29._12_4_ = 0;
            (int)lest__ctx_section_29._12_4_ < (int)lest__ctx_section_29._8_4_;
            lest__ctx_section_29._12_4_ = lest__ctx_section_29._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5258,"nullopt    == disengaged",
                     (allocator<char> *)(score_29.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_5238,lest_env,&local_5258);
          std::__cxx11::string::~string((string *)&local_5258);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_29.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5238), bVar2) {
            do {
              local_5292 = std::operator>(&e1);
              local_5292 = !local_5292;
              local_5290 = (bool *)lest::expression_decomposer::operator<<(&local_5291,&local_5292);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_5288,(expression_lhs *)&local_5290);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5288);
              if (bVar2) {
                local_5331 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_52e0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_52e1);
                lest::location::location(&local_52c0,&local_52e0,0x555);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5308,"!(nullopt > d )",&local_5309);
                std::__cxx11::string::string((string *)&local_5330,(string *)&score_29);
                lest::failure::failure(pfVar8,&local_52c0,&local_5308,&local_5330);
                local_5331 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_53f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_53f9);
                lest::location::location(&local_53d8,&local_53f8,0x555);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5420,"!(nullopt > d )",&local_5421);
                std::__cxx11::string::string((string *)&local_5448,(string *)&score_29);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_53b0,&local_53d8,&local_5420,&local_5448,bVar2);
                lest::env::context_abi_cxx11_(&local_5468,lest_env);
                lest::report(poVar1,&local_53b0,&local_5468);
                std::__cxx11::string::~string((string *)&local_5468);
                lest::passing::~passing((passing *)&local_53b0);
                std::__cxx11::string::~string((string *)&local_5448);
                std::__cxx11::string::~string((string *)&local_5420);
                std::allocator<char>::~allocator(&local_5421);
                lest::location::~location(&local_53d8);
                std::__cxx11::string::~string((string *)&local_53f8);
                std::allocator<char>::~allocator(&local_53f9);
              }
              lest::result::~result((result *)local_5288);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_5238);
          lest__ctx_section_29._8_4_ =
               lest__ctx_section_29._8_4_ - (uint)(lest__ctx_section_29._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_31,&relop<int,_int,_int>::id1366,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_31);
      if (bVar2) {
        lest__ctx_section_30.once = true;
        lest__ctx_section_30._9_3_ = 0;
        for (lest__ctx_section_30._12_4_ = 0;
            (int)lest__ctx_section_30._12_4_ < (int)lest__ctx_section_30._8_4_;
            lest__ctx_section_30._12_4_ = lest__ctx_section_30._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5528,"disengaged == nullopt",
                     (allocator<char> *)(score_30.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_5508,lest_env,&local_5528);
          std::__cxx11::string::~string((string *)&local_5528);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_30.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5508), bVar2) {
            do {
              local_5562 = std::operator>=(&e1);
              local_5560 = (bool *)lest::expression_decomposer::operator<<(&local_5561,&local_5562);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_5558,(expression_lhs *)&local_5560);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5558);
              if (bVar2) {
                local_5601 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_55b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_55b1);
                lest::location::location(&local_5590,&local_55b0,0x556);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_55d8,"(d >= nullopt)",&local_55d9);
                std::__cxx11::string::string((string *)&local_5600,(string *)&score_30);
                lest::failure::failure(pfVar8,&local_5590,&local_55d8,&local_5600);
                local_5601 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_56c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_56c9);
                lest::location::location(&local_56a8,&local_56c8,0x556);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_56f0,"(d >= nullopt)",&local_56f1);
                std::__cxx11::string::string((string *)&local_5718,(string *)&score_30);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5680,&local_56a8,&local_56f0,&local_5718,bVar2);
                lest::env::context_abi_cxx11_(&local_5738,lest_env);
                lest::report(poVar1,&local_5680,&local_5738);
                std::__cxx11::string::~string((string *)&local_5738);
                lest::passing::~passing((passing *)&local_5680);
                std::__cxx11::string::~string((string *)&local_5718);
                std::__cxx11::string::~string((string *)&local_56f0);
                std::allocator<char>::~allocator(&local_56f1);
                lest::location::~location(&local_56a8);
                std::__cxx11::string::~string((string *)&local_56c8);
                std::allocator<char>::~allocator(&local_56c9);
              }
              lest::result::~result((result *)local_5558);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_5508);
          lest__ctx_section_30._8_4_ =
               lest__ctx_section_30._8_4_ - (uint)(lest__ctx_section_30._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_32,&relop<int,_int,_int>::id1367,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_32);
      if (bVar2) {
        lest__ctx_section_31.once = true;
        lest__ctx_section_31._9_3_ = 0;
        for (lest__ctx_section_31._12_4_ = 0;
            (int)lest__ctx_section_31._12_4_ < (int)lest__ctx_section_31._8_4_;
            lest__ctx_section_31._12_4_ = lest__ctx_section_31._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_57f8,"nullopt    == disengaged",
                     (allocator<char> *)(score_31.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_57d8,lest_env,&local_57f8);
          std::__cxx11::string::~string((string *)&local_57f8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_31.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_57d8), bVar2) {
            do {
              local_5832 = std::operator>=(&e1);
              local_5830 = (bool *)lest::expression_decomposer::operator<<(&local_5831,&local_5832);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_5828,(expression_lhs *)&local_5830);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5828);
              if (bVar2) {
                local_58d1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5880,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5881);
                lest::location::location(&local_5860,&local_5880,0x557);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_58a8,"(nullopt >= d )",&local_58a9);
                std::__cxx11::string::string((string *)&local_58d0,(string *)&score_31);
                lest::failure::failure(pfVar8,&local_5860,&local_58a8,&local_58d0);
                local_58d1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5998,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5999);
                lest::location::location(&local_5978,&local_5998,0x557);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_59c0,"(nullopt >= d )",&local_59c1);
                std::__cxx11::string::string((string *)&local_59e8,(string *)&score_31);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5950,&local_5978,&local_59c0,&local_59e8,bVar2);
                lest::env::context_abi_cxx11_(&local_5a08,lest_env);
                lest::report(poVar1,&local_5950,&local_5a08);
                std::__cxx11::string::~string((string *)&local_5a08);
                lest::passing::~passing((passing *)&local_5950);
                std::__cxx11::string::~string((string *)&local_59e8);
                std::__cxx11::string::~string((string *)&local_59c0);
                std::allocator<char>::~allocator(&local_59c1);
                lest::location::~location(&local_5978);
                std::__cxx11::string::~string((string *)&local_5998);
                std::allocator<char>::~allocator(&local_5999);
              }
              lest::result::~result((result *)local_5828);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_57d8);
          lest__ctx_section_31._8_4_ =
               lest__ctx_section_31._8_4_ - (uint)(lest__ctx_section_31._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_33,&relop<int,_int,_int>::id1369,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_33);
      if (bVar2) {
        lest__ctx_section_32.once = true;
        lest__ctx_section_32._9_3_ = 0;
        for (lest__ctx_section_32._12_4_ = 0;
            (int)lest__ctx_section_32._12_4_ < (int)lest__ctx_section_32._8_4_;
            lest__ctx_section_32._12_4_ = lest__ctx_section_32._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5ac8,"engaged    == value",
                     (allocator<char> *)(score_32.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_5aa8,lest_env,&local_5ac8);
          std::__cxx11::string::~string((string *)&local_5ac8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_32.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5aa8), bVar2) {
            do {
              local_5b00 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_5b01,
                                      (optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged);
              local_5b08 = 6;
              lest::expression_lhs<std::optional<int>const&>::operator==
                        ((result *)local_5af8,
                         (expression_lhs<std::optional<int>const&> *)&local_5b00,&local_5b08);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5af8);
              if (bVar2) {
                local_5ba1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5b50,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5b51);
                lest::location::location(&local_5b30,&local_5b50,0x559);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5b78,"e1 == 6",&local_5b79);
                std::__cxx11::string::string((string *)&local_5ba0,(string *)&score_32);
                lest::failure::failure(pfVar8,&local_5b30,&local_5b78,&local_5ba0);
                local_5ba1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5c68,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5c69);
                lest::location::location(&local_5c48,&local_5c68,0x559);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5c90,"e1 == 6",&local_5c91);
                std::__cxx11::string::string((string *)&local_5cb8,(string *)&score_32);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5c20,&local_5c48,&local_5c90,&local_5cb8,bVar2);
                lest::env::context_abi_cxx11_(&local_5cd8,lest_env);
                lest::report(poVar1,&local_5c20,&local_5cd8);
                std::__cxx11::string::~string((string *)&local_5cd8);
                lest::passing::~passing((passing *)&local_5c20);
                std::__cxx11::string::~string((string *)&local_5cb8);
                std::__cxx11::string::~string((string *)&local_5c90);
                std::allocator<char>::~allocator(&local_5c91);
                lest::location::~location(&local_5c48);
                std::__cxx11::string::~string((string *)&local_5c68);
                std::allocator<char>::~allocator(&local_5c69);
              }
              lest::result::~result((result *)local_5af8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_5aa8);
          lest__ctx_section_32._8_4_ =
               lest__ctx_section_32._8_4_ - (uint)(lest__ctx_section_32._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_34,&relop<int,_int,_int>::id1370,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_34);
      if (bVar2) {
        lest__ctx_section_33.once = true;
        lest__ctx_section_33._9_3_ = 0;
        for (lest__ctx_section_33._12_4_ = 0;
            (int)lest__ctx_section_33._12_4_ < (int)lest__ctx_section_33._8_4_;
            lest__ctx_section_33._12_4_ = lest__ctx_section_33._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5d98,"value     == engaged",
                     (allocator<char> *)(score_33.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_5d78,lest_env,&local_5d98);
          std::__cxx11::string::~string((string *)&local_5d98);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_33.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5d78), bVar2) {
            do {
              local_5dd8 = 6;
              local_5dd0 = (int *)lest::expression_decomposer::operator<<(&local_5dd1,&local_5dd8);
              lest::expression_lhs<int_const&>::operator==
                        ((result *)local_5dc8,(expression_lhs<int_const&> *)&local_5dd0,
                         (optional<int> *)
                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5dc8);
              if (bVar2) {
                local_5e71 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5e20,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5e21);
                lest::location::location(&local_5e00,&local_5e20,0x55a);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5e48,"6 == e1",&local_5e49);
                std::__cxx11::string::string((string *)&local_5e70,(string *)&score_33);
                lest::failure::failure(pfVar8,&local_5e00,&local_5e48,&local_5e70);
                local_5e71 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5f38,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5f39);
                lest::location::location(&local_5f18,&local_5f38,0x55a);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5f60,"6 == e1",&local_5f61);
                std::__cxx11::string::string((string *)&local_5f88,(string *)&score_33);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5ef0,&local_5f18,&local_5f60,&local_5f88,bVar2);
                lest::env::context_abi_cxx11_(&local_5fa8,lest_env);
                lest::report(poVar1,&local_5ef0,&local_5fa8);
                std::__cxx11::string::~string((string *)&local_5fa8);
                lest::passing::~passing((passing *)&local_5ef0);
                std::__cxx11::string::~string((string *)&local_5f88);
                std::__cxx11::string::~string((string *)&local_5f60);
                std::allocator<char>::~allocator(&local_5f61);
                lest::location::~location(&local_5f18);
                std::__cxx11::string::~string((string *)&local_5f38);
                std::allocator<char>::~allocator(&local_5f39);
              }
              lest::result::~result((result *)local_5dc8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_5d78);
          lest__ctx_section_33._8_4_ =
               lest__ctx_section_33._8_4_ - (uint)(lest__ctx_section_33._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_35,&relop<int,_int,_int>::id1371,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_35);
      if (bVar2) {
        lest__ctx_section_34.once = true;
        lest__ctx_section_34._9_3_ = 0;
        for (lest__ctx_section_34._12_4_ = 0;
            (int)lest__ctx_section_34._12_4_ < (int)lest__ctx_section_34._8_4_;
            lest__ctx_section_34._12_4_ = lest__ctx_section_34._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6068,"engaged   != value",
                     (allocator<char> *)(score_34.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_6048,lest_env,&local_6068);
          std::__cxx11::string::~string((string *)&local_6068);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_34.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6048), bVar2) {
            do {
              local_60a0 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_60a1,
                                      (optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged);
              local_60a8 = 7;
              lest::expression_lhs<std::optional<int>const&>::operator!=
                        ((result *)local_6098,
                         (expression_lhs<std::optional<int>const&> *)&local_60a0,&local_60a8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6098);
              if (bVar2) {
                local_6141 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_60f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_60f1);
                lest::location::location(&local_60d0,&local_60f0,0x55b);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6118,"e1 != 7",&local_6119);
                std::__cxx11::string::string((string *)&local_6140,(string *)&score_34);
                lest::failure::failure(pfVar8,&local_60d0,&local_6118,&local_6140);
                local_6141 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6208,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6209);
                lest::location::location(&local_61e8,&local_6208,0x55b);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6230,"e1 != 7",&local_6231);
                std::__cxx11::string::string((string *)&local_6258,(string *)&score_34);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_61c0,&local_61e8,&local_6230,&local_6258,bVar2);
                lest::env::context_abi_cxx11_(&local_6278,lest_env);
                lest::report(poVar1,&local_61c0,&local_6278);
                std::__cxx11::string::~string((string *)&local_6278);
                lest::passing::~passing((passing *)&local_61c0);
                std::__cxx11::string::~string((string *)&local_6258);
                std::__cxx11::string::~string((string *)&local_6230);
                std::allocator<char>::~allocator(&local_6231);
                lest::location::~location(&local_61e8);
                std::__cxx11::string::~string((string *)&local_6208);
                std::allocator<char>::~allocator(&local_6209);
              }
              lest::result::~result((result *)local_6098);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_6048);
          lest__ctx_section_34._8_4_ =
               lest__ctx_section_34._8_4_ - (uint)(lest__ctx_section_34._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_36,&relop<int,_int,_int>::id1372,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_36);
      if (bVar2) {
        lest__ctx_section_35.once = true;
        lest__ctx_section_35._9_3_ = 0;
        for (lest__ctx_section_35._12_4_ = 0;
            (int)lest__ctx_section_35._12_4_ < (int)lest__ctx_section_35._8_4_;
            lest__ctx_section_35._12_4_ = lest__ctx_section_35._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6338,"value     != engaged",
                     (allocator<char> *)(score_35.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_6318,lest_env,&local_6338);
          std::__cxx11::string::~string((string *)&local_6338);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_35.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6318), bVar2) {
            do {
              local_6378 = 6;
              local_6370 = (int *)lest::expression_decomposer::operator<<(&local_6371,&local_6378);
              lest::expression_lhs<int_const&>::operator!=
                        ((result *)local_6368,(expression_lhs<int_const&> *)&local_6370,&local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6368);
              if (bVar2) {
                local_6411 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_63c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_63c1);
                lest::location::location(&local_63a0,&local_63c0,0x55c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_63e8,"6 != e2",&local_63e9);
                std::__cxx11::string::string((string *)&local_6410,(string *)&score_35);
                lest::failure::failure(pfVar8,&local_63a0,&local_63e8,&local_6410);
                local_6411 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_64d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_64d9);
                lest::location::location(&local_64b8,&local_64d8,0x55c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6500,"6 != e2",&local_6501);
                std::__cxx11::string::string((string *)&local_6528,(string *)&score_35);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6490,&local_64b8,&local_6500,&local_6528,bVar2);
                lest::env::context_abi_cxx11_(&local_6548,lest_env);
                lest::report(poVar1,&local_6490,&local_6548);
                std::__cxx11::string::~string((string *)&local_6548);
                lest::passing::~passing((passing *)&local_6490);
                std::__cxx11::string::~string((string *)&local_6528);
                std::__cxx11::string::~string((string *)&local_6500);
                std::allocator<char>::~allocator(&local_6501);
                lest::location::~location(&local_64b8);
                std::__cxx11::string::~string((string *)&local_64d8);
                std::allocator<char>::~allocator(&local_64d9);
              }
              lest::result::~result((result *)local_6368);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_6318);
          lest__ctx_section_35._8_4_ =
               lest__ctx_section_35._8_4_ - (uint)(lest__ctx_section_35._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_37,&relop<int,_int,_int>::id1373,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_37);
      if (bVar2) {
        lest__ctx_section_36.once = true;
        lest__ctx_section_36._9_3_ = 0;
        for (lest__ctx_section_36._12_4_ = 0;
            (int)lest__ctx_section_36._12_4_ < (int)lest__ctx_section_36._8_4_;
            lest__ctx_section_36._12_4_ = lest__ctx_section_36._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6608,"engaged   <  value",
                     (allocator<char> *)(score_36.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_65e8,lest_env,&local_6608);
          std::__cxx11::string::~string((string *)&local_6608);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_36.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_65e8), bVar2) {
            do {
              local_6640 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_6641,
                                      (optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged);
              local_6648 = 7;
              lest::expression_lhs<std::optional<int>const&>::operator<
                        ((result *)local_6638,
                         (expression_lhs<std::optional<int>const&> *)&local_6640,&local_6648);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6638);
              if (bVar2) {
                local_66e1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6690,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6691);
                lest::location::location(&local_6670,&local_6690,0x55d);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_66b8,"e1 < 7",&local_66b9);
                std::__cxx11::string::string((string *)&local_66e0,(string *)&score_36);
                lest::failure::failure(pfVar8,&local_6670,&local_66b8,&local_66e0);
                local_66e1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_67a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_67a9);
                lest::location::location(&local_6788,&local_67a8,0x55d);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_67d0,"e1 < 7",&local_67d1);
                std::__cxx11::string::string((string *)&local_67f8,(string *)&score_36);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6760,&local_6788,&local_67d0,&local_67f8,bVar2);
                lest::env::context_abi_cxx11_(&local_6818,lest_env);
                lest::report(poVar1,&local_6760,&local_6818);
                std::__cxx11::string::~string((string *)&local_6818);
                lest::passing::~passing((passing *)&local_6760);
                std::__cxx11::string::~string((string *)&local_67f8);
                std::__cxx11::string::~string((string *)&local_67d0);
                std::allocator<char>::~allocator(&local_67d1);
                lest::location::~location(&local_6788);
                std::__cxx11::string::~string((string *)&local_67a8);
                std::allocator<char>::~allocator(&local_67a9);
              }
              lest::result::~result((result *)local_6638);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_65e8);
          lest__ctx_section_36._8_4_ =
               lest__ctx_section_36._8_4_ - (uint)(lest__ctx_section_36._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_38,&relop<int,_int,_int>::id1374,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_38);
      if (bVar2) {
        lest__ctx_section_37.once = true;
        lest__ctx_section_37._9_3_ = 0;
        for (lest__ctx_section_37._12_4_ = 0;
            (int)lest__ctx_section_37._12_4_ < (int)lest__ctx_section_37._8_4_;
            lest__ctx_section_37._12_4_ = lest__ctx_section_37._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68d8,"value     <  engaged",
                     (allocator<char> *)(score_37.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_68b8,lest_env,&local_68d8);
          std::__cxx11::string::~string((string *)&local_68d8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_37.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_68b8), bVar2) {
            do {
              local_6918 = 6;
              local_6910 = (int *)lest::expression_decomposer::operator<<(&local_6911,&local_6918);
              lest::expression_lhs<int_const&>::operator<
                        ((result *)local_6908,(expression_lhs<int_const&> *)&local_6910,&local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6908);
              if (bVar2) {
                local_69b1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6960,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6961);
                lest::location::location(&local_6940,&local_6960,0x55e);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6988,"6 < e2",&local_6989);
                std::__cxx11::string::string((string *)&local_69b0,(string *)&score_37);
                lest::failure::failure(pfVar8,&local_6940,&local_6988,&local_69b0);
                local_69b1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6a78,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6a79);
                lest::location::location(&local_6a58,&local_6a78,0x55e);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6aa0,"6 < e2",&local_6aa1);
                std::__cxx11::string::string((string *)&local_6ac8,(string *)&score_37);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6a30,&local_6a58,&local_6aa0,&local_6ac8,bVar2);
                lest::env::context_abi_cxx11_(&local_6ae8,lest_env);
                lest::report(poVar1,&local_6a30,&local_6ae8);
                std::__cxx11::string::~string((string *)&local_6ae8);
                lest::passing::~passing((passing *)&local_6a30);
                std::__cxx11::string::~string((string *)&local_6ac8);
                std::__cxx11::string::~string((string *)&local_6aa0);
                std::allocator<char>::~allocator(&local_6aa1);
                lest::location::~location(&local_6a58);
                std::__cxx11::string::~string((string *)&local_6a78);
                std::allocator<char>::~allocator(&local_6a79);
              }
              lest::result::~result((result *)local_6908);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_68b8);
          lest__ctx_section_37._8_4_ =
               lest__ctx_section_37._8_4_ - (uint)(lest__ctx_section_37._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_39,&relop<int,_int,_int>::id1375,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_39);
      if (bVar2) {
        lest__ctx_section_38.once = true;
        lest__ctx_section_38._9_3_ = 0;
        for (lest__ctx_section_38._12_4_ = 0;
            (int)lest__ctx_section_38._12_4_ < (int)lest__ctx_section_38._8_4_;
            lest__ctx_section_38._12_4_ = lest__ctx_section_38._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6ba8,"engaged   <= value",
                     (allocator<char> *)(score_38.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_6b88,lest_env,&local_6ba8);
          std::__cxx11::string::~string((string *)&local_6ba8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_38.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6b88), bVar2) {
            do {
              local_6be0 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_6be1,
                                      (optional<int> *)
                                      &e2.super__Optional_base<int,_true,_true>._M_payload.
                                       super__Optional_payload_base<int>._M_engaged);
              local_6be8 = 7;
              lest::expression_lhs<std::optional<int>const&>::operator<=
                        ((result *)local_6bd8,
                         (expression_lhs<std::optional<int>const&> *)&local_6be0,&local_6be8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6bd8);
              if (bVar2) {
                local_6c81 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6c30,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6c31);
                lest::location::location(&local_6c10,&local_6c30,0x55f);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6c58,"e1 <= 7",&local_6c59);
                std::__cxx11::string::string((string *)&local_6c80,(string *)&score_38);
                lest::failure::failure(pfVar8,&local_6c10,&local_6c58,&local_6c80);
                local_6c81 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6d48,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6d49);
                lest::location::location(&local_6d28,&local_6d48,0x55f);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6d70,"e1 <= 7",&local_6d71);
                std::__cxx11::string::string((string *)&local_6d98,(string *)&score_38);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6d00,&local_6d28,&local_6d70,&local_6d98,bVar2);
                lest::env::context_abi_cxx11_(&local_6db8,lest_env);
                lest::report(poVar1,&local_6d00,&local_6db8);
                std::__cxx11::string::~string((string *)&local_6db8);
                lest::passing::~passing((passing *)&local_6d00);
                std::__cxx11::string::~string((string *)&local_6d98);
                std::__cxx11::string::~string((string *)&local_6d70);
                std::allocator<char>::~allocator(&local_6d71);
                lest::location::~location(&local_6d28);
                std::__cxx11::string::~string((string *)&local_6d48);
                std::allocator<char>::~allocator(&local_6d49);
              }
              lest::result::~result((result *)local_6bd8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_6b88);
          lest__ctx_section_38._8_4_ =
               lest__ctx_section_38._8_4_ - (uint)(lest__ctx_section_38._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_40,&relop<int,_int,_int>::id1376,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_40);
      if (bVar2) {
        lest__ctx_section_39.once = true;
        lest__ctx_section_39._9_3_ = 0;
        for (lest__ctx_section_39._12_4_ = 0;
            (int)lest__ctx_section_39._12_4_ < (int)lest__ctx_section_39._8_4_;
            lest__ctx_section_39._12_4_ = lest__ctx_section_39._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e78,"value     <= engaged",
                     (allocator<char> *)(score_39.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_6e58,lest_env,&local_6e78);
          std::__cxx11::string::~string((string *)&local_6e78);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_39.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6e58), bVar2) {
            do {
              local_6eb8 = 6;
              local_6eb0 = (int *)lest::expression_decomposer::operator<<(&local_6eb1,&local_6eb8);
              lest::expression_lhs<int_const&>::operator<=
                        ((result *)local_6ea8,(expression_lhs<int_const&> *)&local_6eb0,&local_7c);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6ea8);
              if (bVar2) {
                local_6f51 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6f00,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6f01);
                lest::location::location(&local_6ee0,&local_6f00,0x560);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6f28,"6 <= e2",&local_6f29);
                std::__cxx11::string::string((string *)&local_6f50,(string *)&score_39);
                lest::failure::failure(pfVar8,&local_6ee0,&local_6f28,&local_6f50);
                local_6f51 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7018,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7019);
                lest::location::location(&local_6ff8,&local_7018,0x560);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7040,"6 <= e2",&local_7041);
                std::__cxx11::string::string((string *)&local_7068,(string *)&score_39);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6fd0,&local_6ff8,&local_7040,&local_7068,bVar2);
                lest::env::context_abi_cxx11_(&local_7088,lest_env);
                lest::report(poVar1,&local_6fd0,&local_7088);
                std::__cxx11::string::~string((string *)&local_7088);
                lest::passing::~passing((passing *)&local_6fd0);
                std::__cxx11::string::~string((string *)&local_7068);
                std::__cxx11::string::~string((string *)&local_7040);
                std::allocator<char>::~allocator(&local_7041);
                lest::location::~location(&local_6ff8);
                std::__cxx11::string::~string((string *)&local_7018);
                std::allocator<char>::~allocator(&local_7019);
              }
              lest::result::~result((result *)local_6ea8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_6e58);
          lest__ctx_section_39._8_4_ =
               lest__ctx_section_39._8_4_ - (uint)(lest__ctx_section_39._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_41,&relop<int,_int,_int>::id1377,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_41);
      if (bVar2) {
        lest__ctx_section_40.once = true;
        lest__ctx_section_40._9_3_ = 0;
        for (lest__ctx_section_40._12_4_ = 0;
            (int)lest__ctx_section_40._12_4_ < (int)lest__ctx_section_40._8_4_;
            lest__ctx_section_40._12_4_ = lest__ctx_section_40._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7148,"engaged   >  value",
                     (allocator<char> *)(score_40.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_7128,lest_env,&local_7148);
          std::__cxx11::string::~string((string *)&local_7148);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_40.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_7128), bVar2) {
            do {
              local_7180 = (optional<int> *)
                           lest::expression_decomposer::operator<<(&local_7181,&local_7c);
              local_7188 = 6;
              lest::expression_lhs<std::optional<int>const&>::operator>
                        ((result *)local_7178,
                         (expression_lhs<std::optional<int>const&> *)&local_7180,&local_7188);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7178);
              if (bVar2) {
                local_7221 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_71d0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_71d1);
                lest::location::location(&local_71b0,&local_71d0,0x561);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_71f8,"e2 > 6",&local_71f9);
                std::__cxx11::string::string((string *)&local_7220,(string *)&score_40);
                lest::failure::failure(pfVar8,&local_71b0,&local_71f8,&local_7220);
                local_7221 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_72e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_72e9);
                lest::location::location(&local_72c8,&local_72e8,0x561);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7310,"e2 > 6",&local_7311);
                std::__cxx11::string::string((string *)&local_7338,(string *)&score_40);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_72a0,&local_72c8,&local_7310,&local_7338,bVar2);
                lest::env::context_abi_cxx11_(&local_7358,lest_env);
                lest::report(poVar1,&local_72a0,&local_7358);
                std::__cxx11::string::~string((string *)&local_7358);
                lest::passing::~passing((passing *)&local_72a0);
                std::__cxx11::string::~string((string *)&local_7338);
                std::__cxx11::string::~string((string *)&local_7310);
                std::allocator<char>::~allocator(&local_7311);
                lest::location::~location(&local_72c8);
                std::__cxx11::string::~string((string *)&local_72e8);
                std::allocator<char>::~allocator(&local_72e9);
              }
              lest::result::~result((result *)local_7178);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_7128);
          lest__ctx_section_40._8_4_ =
               lest__ctx_section_40._8_4_ - (uint)(lest__ctx_section_40._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_42,&relop<int,_int,_int>::id1378,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_42);
      if (bVar2) {
        lest__ctx_section_41.once = true;
        lest__ctx_section_41._9_3_ = 0;
        for (lest__ctx_section_41._12_4_ = 0;
            (int)lest__ctx_section_41._12_4_ < (int)lest__ctx_section_41._8_4_;
            lest__ctx_section_41._12_4_ = lest__ctx_section_41._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7418,"value     >  engaged",
                     (allocator<char> *)(score_41.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_73f8,lest_env,&local_7418);
          std::__cxx11::string::~string((string *)&local_7418);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_41.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_73f8), bVar2) {
            do {
              local_7458 = 7;
              local_7450 = (int *)lest::expression_decomposer::operator<<(&local_7451,&local_7458);
              lest::expression_lhs<int_const&>::operator>
                        ((result *)local_7448,(expression_lhs<int_const&> *)&local_7450,
                         (optional<int> *)
                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7448);
              if (bVar2) {
                local_74f1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_74a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_74a1);
                lest::location::location(&local_7480,&local_74a0,0x562);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_74c8,"7 > e1",&local_74c9);
                std::__cxx11::string::string((string *)&local_74f0,(string *)&score_41);
                lest::failure::failure(pfVar8,&local_7480,&local_74c8,&local_74f0);
                local_74f1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_75b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_75b9);
                lest::location::location(&local_7598,&local_75b8,0x562);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_75e0,"7 > e1",&local_75e1);
                std::__cxx11::string::string((string *)&local_7608,(string *)&score_41);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7570,&local_7598,&local_75e0,&local_7608,bVar2);
                lest::env::context_abi_cxx11_(&local_7628,lest_env);
                lest::report(poVar1,&local_7570,&local_7628);
                std::__cxx11::string::~string((string *)&local_7628);
                lest::passing::~passing((passing *)&local_7570);
                std::__cxx11::string::~string((string *)&local_7608);
                std::__cxx11::string::~string((string *)&local_75e0);
                std::allocator<char>::~allocator(&local_75e1);
                lest::location::~location(&local_7598);
                std::__cxx11::string::~string((string *)&local_75b8);
                std::allocator<char>::~allocator(&local_75b9);
              }
              lest::result::~result((result *)local_7448);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_73f8);
          lest__ctx_section_41._8_4_ =
               lest__ctx_section_41._8_4_ - (uint)(lest__ctx_section_41._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_43,&relop<int,_int,_int>::id1379,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_43);
      if (bVar2) {
        lest__ctx_section_42.once = true;
        lest__ctx_section_42._9_3_ = 0;
        for (lest__ctx_section_42._12_4_ = 0;
            (int)lest__ctx_section_42._12_4_ < (int)lest__ctx_section_42._8_4_;
            lest__ctx_section_42._12_4_ = lest__ctx_section_42._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_76e8,"engaged   >= value",
                     (allocator<char> *)(score_42.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_76c8,lest_env,&local_76e8);
          std::__cxx11::string::~string((string *)&local_76e8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_42.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_76c8), bVar2) {
            do {
              local_7720 = (optional<int> *)
                           lest::expression_decomposer::operator<<(&local_7721,&local_7c);
              local_7728 = 6;
              lest::expression_lhs<std::optional<int>const&>::operator>=
                        ((result *)local_7718,
                         (expression_lhs<std::optional<int>const&> *)&local_7720,&local_7728);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7718);
              if (bVar2) {
                local_77c1 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7770,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7771);
                lest::location::location(&local_7750,&local_7770,0x563);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7798,"e2 >= 6",&local_7799);
                std::__cxx11::string::string((string *)&local_77c0,(string *)&score_42);
                lest::failure::failure(pfVar8,&local_7750,&local_7798,&local_77c0);
                local_77c1 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7888,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7889);
                lest::location::location(&local_7868,&local_7888,0x563);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_78b0,"e2 >= 6",&local_78b1);
                std::__cxx11::string::string((string *)&local_78d8,(string *)&score_42);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7840,&local_7868,&local_78b0,&local_78d8,bVar2);
                lest::env::context_abi_cxx11_(&local_78f8,lest_env);
                lest::report(poVar1,&local_7840,&local_78f8);
                std::__cxx11::string::~string((string *)&local_78f8);
                lest::passing::~passing((passing *)&local_7840);
                std::__cxx11::string::~string((string *)&local_78d8);
                std::__cxx11::string::~string((string *)&local_78b0);
                std::allocator<char>::~allocator(&local_78b1);
                lest::location::~location(&local_7868);
                std::__cxx11::string::~string((string *)&local_7888);
                std::allocator<char>::~allocator(&local_7889);
              }
              lest::result::~result((result *)local_7718);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_76c8);
          lest__ctx_section_42._8_4_ =
               lest__ctx_section_42._8_4_ - (uint)(lest__ctx_section_42._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_44,&relop<int,_int,_int>::id1380,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_44);
      if (bVar2) {
        lest__ctx_section_43.once = true;
        lest__ctx_section_43._9_3_ = 0;
        for (lest__ctx_section_43._12_4_ = 0;
            (int)lest__ctx_section_43._12_4_ < (int)lest__ctx_section_43._8_4_;
            lest__ctx_section_43._12_4_ = lest__ctx_section_43._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_79b8,"value     >= engaged",
                     (allocator<char> *)(score_43.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_7998,lest_env,&local_79b8);
          std::__cxx11::string::~string((string *)&local_79b8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_43.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_7998), bVar2) {
            do {
              local_79f8 = 7;
              local_79f0 = (int *)lest::expression_decomposer::operator<<(&local_79f1,&local_79f8);
              lest::expression_lhs<int_const&>::operator>=
                        ((result *)local_79e8,(expression_lhs<int_const&> *)&local_79f0,
                         (optional<int> *)
                         &e2.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_79e8);
              if (bVar2) {
                local_7a91 = 1;
                pfVar8 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7a40,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7a41);
                lest::location::location(&local_7a20,&local_7a40,0x564);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7a68,"7 >= e1",&local_7a69);
                std::__cxx11::string::string((string *)&local_7a90,(string *)&score_43);
                lest::failure::failure(pfVar8,&local_7a20,&local_7a68,&local_7a90);
                local_7a91 = 0;
                __cxa_throw(pfVar8,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7b58,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7b59);
                lest::location::location(&local_7b38,&local_7b58,0x564);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7b80,"7 >= e1",&local_7b81);
                std::__cxx11::string::string((string *)&local_7ba8,(string *)&score_43);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7b10,&local_7b38,&local_7b80,&local_7ba8,bVar2);
                lest::env::context_abi_cxx11_(&local_7bc8,lest_env);
                lest::report(poVar1,&local_7b10,&local_7bc8);
                std::__cxx11::string::~string((string *)&local_7bc8);
                lest::passing::~passing((passing *)&local_7b10);
                std::__cxx11::string::~string((string *)&local_7ba8);
                std::__cxx11::string::~string((string *)&local_7b80);
                std::allocator<char>::~allocator(&local_7b81);
                lest::location::~location(&local_7b38);
                std::__cxx11::string::~string((string *)&local_7b58);
                std::allocator<char>::~allocator(&local_7b59);
              }
              lest::result::~result((result *)local_79e8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          lest::ctx::~ctx((ctx *)local_7998);
          lest__ctx_section_43._8_4_ =
               lest__ctx_section_43._8_4_ - (uint)(lest__ctx_section_43._12_4_ == 0);
        }
      }
    }
    lest::ctx::~ctx((ctx *)local_28);
    lest__ctx_setup._8_4_ = lest__ctx_setup._8_4_ - (uint)(lest__ctx_setup._12_4_ == 0);
    lest__ctx_setup._12_4_ = lest__ctx_setup._12_4_ + 1;
  } while( true );
}

Assistant:

void relop( lest::env & lest_env )
{
    SETUP( "" ) {
        optional<R> d;
        optional<S> e1( 6 );
        optional<T> e2( 7 );

    SECTION( "engaged    == engaged"    ) { EXPECT(   e1 == e1  ); }
    SECTION( "engaged    == disengaged" ) { EXPECT( !(e1 == d ) ); }
    SECTION( "disengaged == engaged"    ) { EXPECT( !(d  == e1) ); }

    SECTION( "engaged    != engaged"    ) { EXPECT(   e1 != e2  ); }
    SECTION( "engaged    != disengaged" ) { EXPECT(   e1 != d   ); }
    SECTION( "disengaged != engaged"    ) { EXPECT(   d  != e2  ); }

    SECTION( "engaged    <  engaged"    ) { EXPECT(   e1 <  e2  ); }
    SECTION( "engaged    <  disengaged" ) { EXPECT( !(e1 <  d ) ); }
    SECTION( "disengaged <  engaged"    ) { EXPECT(   d  <  e2  ); }

    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e1  ); }
    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e2  ); }
    SECTION( "engaged    <= disengaged" ) { EXPECT( !(e1 <= d ) ); }
    SECTION( "disengaged <= engaged"    ) { EXPECT(   d  <= e2  ); }

    SECTION( "engaged    >  engaged"    ) { EXPECT(   e2 >  e1  ); }
    SECTION( "engaged    >  disengaged" ) { EXPECT(   e2 >  d   ); }
    SECTION( "disengaged >  engaged"    ) { EXPECT( !(d  >  e1) ); }

    SECTION( "engaged    >= engaged"    ) { EXPECT(   e1 >= e1  ); }
    SECTION( "engaged    >= engaged"    ) { EXPECT(   e2 >= e1  ); }
    SECTION( "engaged    >= disengaged" ) { EXPECT(   e2 >= d   ); }
    SECTION( "disengaged >= engaged"    ) { EXPECT( !(d  >= e1) ); }

    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       == nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt == d      ) ); }
    SECTION( "engaged    == nullopt"    ) { EXPECT(  (e1      != nullopt) ); }
    SECTION( "nullopt    == engaged"    ) { EXPECT(  (nullopt != e1     ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       <  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt <  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       <= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt <= d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       >  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt >  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       >= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt >= d      ) ); }

    SECTION( "engaged    == value"      ) { EXPECT( e1 == 6  ); }
    SECTION( "value     == engaged"     ) { EXPECT(  6 == e1 ); }
    SECTION( "engaged   != value"       ) { EXPECT( e1 != 7  ); }
    SECTION( "value     != engaged"     ) { EXPECT(  6 != e2 ); }
    SECTION( "engaged   <  value"       ) { EXPECT( e1 <  7  ); }
    SECTION( "value     <  engaged"     ) { EXPECT(  6 <  e2 ); }
    SECTION( "engaged   <= value"       ) { EXPECT( e1 <= 7  ); }
    SECTION( "value     <= engaged"     ) { EXPECT(  6 <= e2 ); }
    SECTION( "engaged   >  value"       ) { EXPECT( e2 >  6  ); }
    SECTION( "value     >  engaged"     ) { EXPECT(  7 >  e1 ); }
    SECTION( "engaged   >= value"       ) { EXPECT( e2 >= 6  ); }
    SECTION( "value     >= engaged"     ) { EXPECT(  7 >= e1 ); }
    }
}